

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-bench.cpp
# Opt level: O0

cmd_params * parse_cmd_params(int argc,char **argv)

{
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last_01;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last_02;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last_03;
  __normal_iterator<ggml_type_*,_std::vector<ggml_type,_std::allocator<ggml_type>_>_> __last_04;
  __normal_iterator<ggml_type_*,_std::vector<ggml_type,_std::allocator<ggml_type>_>_> __last_05;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last_06;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last_07;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last_08;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last_09;
  __normal_iterator<llama_split_mode_*,_std::vector<llama_split_mode,_std::allocator<llama_split_mode>_>_>
  __last_10;
  _Bit_iterator __first;
  _Bit_iterator __first_00;
  _Bit_iterator __first_01;
  _Bit_iterator __first_02;
  _Bit_iterator __first_03;
  const_iterator __position;
  const_iterator __position_00;
  const_iterator __position_01;
  const_iterator __position_02;
  const_iterator __position_03;
  _Bit_iterator __last_11;
  _Bit_iterator __last_12;
  _Bit_iterator __last_13;
  _Bit_iterator __last_14;
  _Bit_iterator __last_15;
  bool bVar1;
  byte bVar2;
  int iVar3;
  string *psVar4;
  size_type sVar5;
  reference pbVar6;
  vector<bool,_std::allocator<bool>_> *pvVar7;
  reference pvVar8;
  undefined8 uVar9;
  long in_RDX;
  int in_ESI;
  cmd_params *in_RDI;
  iterator iVar10;
  iterator iVar11;
  undefined1 auVar12 [12];
  size_t i_1;
  vector<float,_std::allocator<float>_> tensor_split;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  split_arg;
  sregex_token_iterator it;
  regex regex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ts;
  iterator __end25;
  iterator __begin25;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range25;
  vector<bool,_std::allocator<bool>_> p_17;
  vector<bool,_std::allocator<bool>_> p_16;
  vector<bool,_std::allocator<bool>_> p_15;
  string value;
  vector<bool,_std::allocator<bool>_> p_14;
  llama_split_mode mode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *m;
  iterator __end18;
  iterator __begin18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range18;
  vector<llama_split_mode,_std::allocator<llama_split_mode>_> modes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  p_13;
  vector<int,_std::allocator<int>_> p_12;
  vector<int,_std::allocator<int>_> p_11;
  vector<bool,_std::allocator<bool>_> p_10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  p_9;
  vector<int,_std::allocator<int>_> p_8;
  ggml_type gt_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t_1;
  iterator __end11;
  iterator __begin11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range11;
  vector<ggml_type,_std::allocator<ggml_type>_> types_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  p_7;
  ggml_type gt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  iterator __end10;
  iterator __begin10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range10;
  vector<ggml_type,_std::allocator<ggml_type>_> types;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  p_6;
  vector<int,_std::allocator<int>_> p_5;
  vector<int,_std::allocator<int>_> p_4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  p_3;
  vector<int,_std::allocator<int>_> p_2;
  vector<int,_std::allocator<int>_> p_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  p;
  int i;
  char split_delim;
  string arg_prefix;
  bool invalid_param;
  string arg;
  cmd_params *params;
  string *in_stack_ffffffffffffec58;
  cmd_params *in_stack_ffffffffffffec60;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffec68;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffec70;
  FILE *__stream;
  undefined4 in_stack_ffffffffffffec78;
  undefined1 in_stack_ffffffffffffec7c;
  undefined1 in_stack_ffffffffffffec7d;
  undefined1 in_stack_ffffffffffffec7e;
  undefined1 in_stack_ffffffffffffec7f;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  *in_stack_ffffffffffffec80;
  undefined4 in_stack_ffffffffffffec90;
  undefined1 in_stack_ffffffffffffec94;
  undefined1 in_stack_ffffffffffffec95;
  undefined1 in_stack_ffffffffffffec96;
  undefined1 in_stack_ffffffffffffec97;
  char *in_stack_ffffffffffffec98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeca0;
  undefined2 in_stack_ffffffffffffeca8;
  undefined1 in_stack_ffffffffffffecaa;
  undefined1 in_stack_ffffffffffffecab;
  int in_stack_ffffffffffffecac;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_ffffffffffffecb0;
  const_iterator in_stack_ffffffffffffecb8;
  undefined4 in_stack_ffffffffffffecc0;
  ggml_sched_priority in_stack_ffffffffffffecc4;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffecc8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffecd0;
  undefined2 in_stack_ffffffffffffecf0;
  undefined1 in_stack_ffffffffffffecf2;
  undefined1 in_stack_ffffffffffffecf3;
  value_type in_stack_ffffffffffffecf4;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffecf8;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffed00;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffed20;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffed28;
  undefined1 *in_stack_ffffffffffffed30;
  string *in_stack_ffffffffffffed38;
  undefined8 in_stack_ffffffffffffed40;
  undefined4 in_stack_ffffffffffffed60;
  uint in_stack_ffffffffffffed64;
  _Bit_type *in_stack_ffffffffffffed68;
  undefined4 in_stack_ffffffffffffed98;
  uint in_stack_ffffffffffffed9c;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  *in_stack_ffffffffffffeda0;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  *in_stack_ffffffffffffeda8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffedb0;
  char in_stack_ffffffffffffefb7;
  string *in_stack_ffffffffffffefb8;
  allocator<char> local_e89;
  string local_e88 [39];
  undefined1 local_e61 [40];
  undefined1 local_e39 [40];
  allocator<char> local_e11;
  string local_e10 [39];
  allocator<char> local_de9;
  string local_de8 [32];
  vector<bool,_std::allocator<bool>_> *local_dc8;
  vector<float,_std::allocator<float>_> local_db8;
  undefined1 local_d99 [177];
  char **in_stack_fffffffffffff318;
  int in_stack_fffffffffffff324;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c88;
  undefined8 local_c70;
  undefined8 local_c60;
  string local_ba8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b88;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b80;
  allocator<char> local_b71;
  string local_b70 [32];
  undefined1 local_b50 [24];
  undefined1 *local_b38;
  _Bit_type *local_b30;
  uint local_b28;
  string *local_b20;
  uint local_b18;
  string *local_b10;
  uint uStack_b08;
  undefined4 uStack_b04;
  _Bit_type *local_b00;
  uint local_af8;
  _Bit_type *local_af0;
  uint local_ae8;
  _Bit_type *local_ae0;
  uint local_ad8;
  _Bit_type *local_ad0;
  uint local_ac8;
  allocator<char> local_aa9;
  string local_aa8 [32];
  vector<bool,_std::allocator<bool>_> local_a88;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  *local_a60;
  uint local_a58;
  string *local_a50;
  uint local_a48;
  string *local_a40;
  uint uStack_a38;
  undefined4 uStack_a34;
  _Bit_type *local_a30;
  uint local_a28;
  _Bit_type *local_a20;
  uint local_a18;
  _Bit_type *local_a10;
  uint local_a08;
  _Bit_type *local_a00;
  uint local_9f8;
  allocator<char> local_9d9;
  string local_9d8 [32];
  vector<bool,_std::allocator<bool>_> local_9b8;
  _Bit_type *local_990;
  uint local_988;
  string *local_980;
  uint local_978;
  string *local_970;
  uint uStack_968;
  undefined4 uStack_964;
  _Bit_type *local_960;
  uint local_958;
  _Bit_type *local_950;
  uint local_948;
  _Bit_type *local_940;
  uint local_938;
  _Bit_type *local_930;
  uint local_928;
  allocator<char> local_909;
  string local_908 [32];
  vector<bool,_std::allocator<bool>_> local_8e8;
  allocator<char> local_8b9;
  string local_8b8 [32];
  _Bit_type *local_898;
  uint local_890;
  string *local_888;
  uint local_880;
  string *local_878;
  uint uStack_870;
  undefined4 uStack_86c;
  _Bit_type *local_868;
  uint local_860;
  _Bit_type *local_858;
  uint local_850;
  _Bit_type *local_848;
  uint local_840;
  _Bit_type *local_838;
  uint local_830;
  allocator<char> local_811;
  string local_810 [32];
  vector<bool,_std::allocator<bool>_> local_7f0;
  allocator<char> local_7c1;
  string local_7c0 [56];
  llama_split_mode *local_788;
  llama_split_mode *local_780;
  llama_split_mode *local_778;
  llama_split_mode *local_770;
  undefined4 local_75c;
  reference local_758;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_750;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_748;
  undefined1 *local_740;
  allocator<char> local_719;
  string local_718 [32];
  undefined1 local_6f8 [31];
  allocator<char> local_6d9;
  string local_6d8 [32];
  int *local_6b8;
  int *local_6b0;
  int *local_6a8;
  int *local_6a0;
  allocator<char> local_689;
  string local_688 [56];
  int *local_650;
  int *local_648;
  int *local_640;
  int *local_638;
  allocator<char> local_621;
  string local_620 [56];
  _Bit_type *local_5e8;
  uint local_5e0;
  string *local_5d8;
  uint local_5d0;
  string *local_5c8;
  uint uStack_5c0;
  undefined4 uStack_5bc;
  _Bit_type *local_5b8;
  uint local_5b0;
  _Bit_type *local_5a8;
  uint local_5a0;
  _Bit_type *local_598;
  uint local_590;
  _Bit_type *local_588;
  uint local_580;
  allocator<char> local_561;
  string local_560 [32];
  vector<bool,_std::allocator<bool>_> local_540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_500;
  allocator<char> local_4e9;
  string local_4e8 [56];
  int *local_4b0;
  int *local_4a8;
  int *local_4a0;
  int *local_498;
  allocator<char> local_481;
  string local_480 [56];
  ggml_type *local_448;
  ggml_type *local_440;
  ggml_type *local_438;
  ggml_type *local_430;
  ggml_type local_41c;
  reference local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_410;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_408;
  undefined1 *local_400;
  undefined1 local_3f8 [32];
  string local_3d8 [32];
  undefined1 local_3b8 [24];
  ggml_type *local_3a0;
  ggml_type *local_398;
  ggml_type *local_390;
  ggml_type *local_388;
  ggml_type local_374;
  reference local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_368;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_360;
  undefined1 *local_358;
  allocator<char> local_331;
  string local_330 [32];
  undefined1 local_310 [24];
  int *local_2f8;
  int *local_2f0;
  int *local_2e8;
  int *local_2e0;
  allocator<char> local_2c9;
  string local_2c8 [56];
  int *local_290;
  int *local_288;
  int *local_280;
  int *local_278;
  allocator<char> local_261;
  string local_260 [56];
  int local_228;
  int local_224;
  pair<int,_int> local_220;
  int local_218;
  allocator<char> local_211;
  string local_210 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f0;
  int *local_1d8;
  int *local_1d0;
  int *local_1c8;
  int *local_1c0;
  allocator<char> local_1a9;
  string local_1a8 [56];
  int *local_170;
  int *local_168;
  int *local_160;
  int *local_158;
  allocator<char> local_141;
  string local_140 [56];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  allocator<char> local_d9;
  string local_d8 [62];
  undefined1 local_9a;
  undefined1 local_99;
  undefined8 local_98;
  undefined8 local_90;
  int local_84;
  undefined1 local_7d;
  undefined4 local_7c;
  undefined8 local_78;
  allocator<char> local_69;
  string local_68 [39];
  byte local_41;
  string local_40 [39];
  byte local_19;
  long local_18;
  int local_c;
  
  local_19 = 0;
  local_18 = in_RDX;
  local_c = in_ESI;
  cmd_params::cmd_params(in_stack_ffffffffffffec60);
  std::__cxx11::string::string(local_40);
  local_41 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffeca0,in_stack_ffffffffffffec98,
             (allocator<char> *)
             CONCAT17(in_stack_ffffffffffffec97,
                      CONCAT16(in_stack_ffffffffffffec96,
                               CONCAT15(in_stack_ffffffffffffec95,
                                        CONCAT14(in_stack_ffffffffffffec94,in_stack_ffffffffffffec90
                                                )))));
  std::allocator<char>::~allocator(&local_69);
  local_7d = 0x2c;
  in_RDI->verbose = (bool)(cmd_params_defaults.verbose & 1);
  in_RDI->output_format = cmd_params_defaults.output_format;
  in_RDI->output_format_stderr = cmd_params_defaults.output_format_stderr;
  in_RDI->reps = cmd_params_defaults.reps;
  in_RDI->numa = cmd_params_defaults.numa;
  in_RDI->prio = cmd_params_defaults.prio;
  in_RDI->delay = cmd_params_defaults.delay;
  in_RDI->progress = (bool)(cmd_params_defaults.progress & 1);
  local_84 = 1;
LAB_0015d7a4:
  if (local_c <= local_84) {
LAB_00161a81:
    if ((local_41 & 1) == 0) {
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffec70._M_current);
      if (bVar1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffed00,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffecf8);
      }
      bVar1 = std::vector<int,_std::allocator<int>_>::empty
                        ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffec70._M_current);
      if (bVar1) {
        std::vector<int,_std::allocator<int>_>::operator=
                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffed00,
                   (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffecf8);
      }
      bVar1 = std::vector<int,_std::allocator<int>_>::empty
                        ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffec70._M_current);
      if (bVar1) {
        std::vector<int,_std::allocator<int>_>::operator=
                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffed00,
                   (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffecf8);
      }
      bVar1 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::empty
                        ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                         in_stack_ffffffffffffec70._M_current);
      if (bVar1) {
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator=
                  ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                   in_stack_ffffffffffffed00,
                   (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                   in_stack_ffffffffffffecf8);
      }
      bVar1 = std::vector<int,_std::allocator<int>_>::empty
                        ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffec70._M_current);
      if (bVar1) {
        std::vector<int,_std::allocator<int>_>::operator=
                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffed00,
                   (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffecf8);
      }
      bVar1 = std::vector<int,_std::allocator<int>_>::empty
                        ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffec70._M_current);
      if (bVar1) {
        std::vector<int,_std::allocator<int>_>::operator=
                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffed00,
                   (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffecf8);
      }
      bVar1 = std::vector<ggml_type,_std::allocator<ggml_type>_>::empty
                        ((vector<ggml_type,_std::allocator<ggml_type>_> *)
                         in_stack_ffffffffffffec70._M_current);
      if (bVar1) {
        std::vector<ggml_type,_std::allocator<ggml_type>_>::operator=
                  ((vector<ggml_type,_std::allocator<ggml_type>_> *)in_stack_ffffffffffffed00,
                   (vector<ggml_type,_std::allocator<ggml_type>_> *)in_stack_ffffffffffffecf8);
      }
      bVar1 = std::vector<ggml_type,_std::allocator<ggml_type>_>::empty
                        ((vector<ggml_type,_std::allocator<ggml_type>_> *)
                         in_stack_ffffffffffffec70._M_current);
      if (bVar1) {
        std::vector<ggml_type,_std::allocator<ggml_type>_>::operator=
                  ((vector<ggml_type,_std::allocator<ggml_type>_> *)in_stack_ffffffffffffed00,
                   (vector<ggml_type,_std::allocator<ggml_type>_> *)in_stack_ffffffffffffecf8);
      }
      bVar1 = std::vector<int,_std::allocator<int>_>::empty
                        ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffec70._M_current);
      if (bVar1) {
        std::vector<int,_std::allocator<int>_>::operator=
                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffed00,
                   (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffecf8);
      }
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffec70._M_current);
      if (bVar1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffed00,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffecf8);
      }
      bVar1 = std::vector<llama_split_mode,_std::allocator<llama_split_mode>_>::empty
                        ((vector<llama_split_mode,_std::allocator<llama_split_mode>_> *)
                         in_stack_ffffffffffffec70._M_current);
      if (bVar1) {
        std::vector<llama_split_mode,_std::allocator<llama_split_mode>_>::operator=
                  ((vector<llama_split_mode,_std::allocator<llama_split_mode>_> *)
                   in_stack_ffffffffffffed00,
                   (vector<llama_split_mode,_std::allocator<llama_split_mode>_> *)
                   in_stack_ffffffffffffecf8);
      }
      bVar1 = std::vector<int,_std::allocator<int>_>::empty
                        ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffec70._M_current);
      if (bVar1) {
        std::vector<int,_std::allocator<int>_>::operator=
                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffed00,
                   (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffecf8);
      }
      bVar1 = std::vector<bool,_std::allocator<bool>_>::empty
                        ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffeca0);
      if (bVar1) {
        std::vector<bool,_std::allocator<bool>_>::operator=
                  (in_stack_ffffffffffffecf8,
                   (vector<bool,_std::allocator<bool>_> *)
                   CONCAT44(in_stack_ffffffffffffecf4,
                            CONCAT13(in_stack_ffffffffffffecf3,
                                     CONCAT12(in_stack_ffffffffffffecf2,in_stack_ffffffffffffecf0)))
                  );
      }
      bVar1 = std::vector<bool,_std::allocator<bool>_>::empty
                        ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffeca0);
      if (bVar1) {
        std::vector<bool,_std::allocator<bool>_>::operator=
                  (in_stack_ffffffffffffecf8,
                   (vector<bool,_std::allocator<bool>_> *)
                   CONCAT44(in_stack_ffffffffffffecf4,
                            CONCAT13(in_stack_ffffffffffffecf3,
                                     CONCAT12(in_stack_ffffffffffffecf2,in_stack_ffffffffffffecf0)))
                  );
      }
      bVar1 = std::
              vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              ::empty((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       *)in_stack_ffffffffffffec70._M_current);
      if (bVar1) {
        std::
        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ::operator=((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     *)in_stack_ffffffffffffed00,
                    (vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     *)in_stack_ffffffffffffecf8);
      }
      bVar1 = std::vector<bool,_std::allocator<bool>_>::empty
                        ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffeca0);
      if (bVar1) {
        std::vector<bool,_std::allocator<bool>_>::operator=
                  (in_stack_ffffffffffffecf8,
                   (vector<bool,_std::allocator<bool>_> *)
                   CONCAT44(in_stack_ffffffffffffecf4,
                            CONCAT13(in_stack_ffffffffffffecf3,
                                     CONCAT12(in_stack_ffffffffffffecf2,in_stack_ffffffffffffecf0)))
                  );
      }
      bVar1 = std::vector<bool,_std::allocator<bool>_>::empty
                        ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffeca0);
      if (bVar1) {
        std::vector<bool,_std::allocator<bool>_>::operator=
                  (in_stack_ffffffffffffecf8,
                   (vector<bool,_std::allocator<bool>_> *)
                   CONCAT44(in_stack_ffffffffffffecf4,
                            CONCAT13(in_stack_ffffffffffffecf3,
                                     CONCAT12(in_stack_ffffffffffffecf2,in_stack_ffffffffffffecf0)))
                  );
      }
      bVar1 = std::vector<int,_std::allocator<int>_>::empty
                        ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffec70._M_current);
      if (bVar1) {
        std::vector<int,_std::allocator<int>_>::operator=
                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffed00,
                   (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffecf8);
      }
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffec70._M_current);
      if (bVar1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffed00,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffecf8);
      }
      bVar1 = std::vector<bool,_std::allocator<bool>_>::empty
                        ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffeca0);
      if (bVar1) {
        std::vector<bool,_std::allocator<bool>_>::operator=
                  (in_stack_ffffffffffffecf8,
                   (vector<bool,_std::allocator<bool>_> *)
                   CONCAT44(in_stack_ffffffffffffecf4,
                            CONCAT13(in_stack_ffffffffffffecf3,
                                     CONCAT12(in_stack_ffffffffffffecf2,in_stack_ffffffffffffecf0)))
                  );
      }
      bVar1 = std::vector<int,_std::allocator<int>_>::empty
                        ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffec70._M_current);
      if (bVar1) {
        std::vector<int,_std::allocator<int>_>::operator=
                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffed00,
                   (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffecf8);
      }
      local_19 = 1;
      local_218 = 1;
      std::__cxx11::string::~string(local_68);
      std::__cxx11::string::~string(local_40);
      if ((local_19 & 1) == 0) {
        cmd_params::~cmd_params(in_stack_ffffffffffffec60);
      }
      return in_RDI;
    }
    __stream = _stderr;
    uVar9 = std::__cxx11::string::c_str();
    fprintf(__stream,"error: invalid parameter for argument: %s\n",uVar9);
    print_usage(in_stack_fffffffffffff324,in_stack_fffffffffffff318);
    exit(1);
  }
  std::__cxx11::string::operator=(local_40,*(char **)(local_18 + (long)local_84 * 8));
  psVar4 = (string *)std::__cxx11::string::size();
  iVar3 = std::__cxx11::string::compare((ulong)local_40,0,psVar4);
  if (iVar3 == 0) {
    local_90 = std::__cxx11::string::begin();
    local_98 = std::__cxx11::string::end();
    local_99 = 0x5f;
    local_9a = 0x2d;
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (in_stack_ffffffffffffec70,in_stack_ffffffffffffec68,(char *)in_stack_ffffffffffffec60
               ,(char *)in_stack_ffffffffffffec58);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_ffffffffffffec60,(char *)in_stack_ffffffffffffec58);
  if ((bVar1) ||
     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffec60,(char *)in_stack_ffffffffffffec58), bVar1))
  {
    print_usage(in_stack_fffffffffffff324,in_stack_fffffffffffff318);
    exit(0);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_ffffffffffffec60,(char *)in_stack_ffffffffffffec58);
  if ((bVar1) ||
     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffec60,(char *)in_stack_ffffffffffffec58), bVar1))
  {
    local_84 = local_84 + 1;
    if (local_c <= local_84) {
      local_41 = 1;
      goto LAB_00161a81;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffeca0,in_stack_ffffffffffffec98,
               (allocator<char> *)
               CONCAT17(in_stack_ffffffffffffec97,
                        CONCAT16(in_stack_ffffffffffffec96,
                                 CONCAT15(in_stack_ffffffffffffec95,
                                          CONCAT14(in_stack_ffffffffffffec94,
                                                   in_stack_ffffffffffffec90)))));
    string_split<std::__cxx11::string>
              ((string *)in_stack_ffffffffffffecc8._M_current,
               (char)(in_stack_ffffffffffffecc4 >> 0x18));
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator(&local_d9);
    local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffec58);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_ffffffffffffec60,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_ffffffffffffec58);
    local_f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_ffffffffffffec58);
    local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffec58);
    __last._M_current._2_1_ = in_stack_ffffffffffffecaa;
    __last._M_current._0_2_ = in_stack_ffffffffffffeca8;
    __last._M_current._3_1_ = in_stack_ffffffffffffecab;
    __last._M_current._4_4_ = in_stack_ffffffffffffecac;
    local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)in_stack_ffffffffffffeca0,in_stack_ffffffffffffecb8,
                           in_stack_ffffffffffffecb0,__last);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffec70._M_current);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffec60,(char *)in_stack_ffffffffffffec58);
    if ((bVar1) ||
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_ffffffffffffec60,(char *)in_stack_ffffffffffffec58), bVar1
       )) {
      local_84 = local_84 + 1;
      if (local_c <= local_84) {
        local_41 = 1;
        goto LAB_00161a81;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffeca0,in_stack_ffffffffffffec98,
                 (allocator<char> *)
                 CONCAT17(in_stack_ffffffffffffec97,
                          CONCAT16(in_stack_ffffffffffffec96,
                                   CONCAT15(in_stack_ffffffffffffec95,
                                            CONCAT14(in_stack_ffffffffffffec94,
                                                     in_stack_ffffffffffffec90)))));
      string_split<int>(in_stack_ffffffffffffefb8,in_stack_ffffffffffffefb7);
      std::__cxx11::string::~string(local_140);
      std::allocator<char>::~allocator(&local_141);
      local_158 = (int *)std::vector<int,_std::allocator<int>_>::end
                                   ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffec58);
      __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
      __normal_iterator<int*>
                ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 in_stack_ffffffffffffec60,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 in_stack_ffffffffffffec58);
      local_160 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                   ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffec58);
      local_168 = (int *)std::vector<int,_std::allocator<int>_>::end
                                   ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffec58);
      __last_00._M_current._2_1_ = in_stack_ffffffffffffecaa;
      __last_00._M_current._0_2_ = in_stack_ffffffffffffeca8;
      __last_00._M_current._3_1_ = in_stack_ffffffffffffecab;
      __last_00._M_current._4_4_ = in_stack_ffffffffffffecac;
      local_170 = (int *)std::vector<int,std::allocator<int>>::
                         insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                                   ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffeca0,
                                    (const_iterator)in_stack_ffffffffffffecb8._M_current,
                                    (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                     )in_stack_ffffffffffffecb0._M_current,__last_00);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffec70._M_current);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffec60,(char *)in_stack_ffffffffffffec58);
      if ((bVar1) ||
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_ffffffffffffec60,(char *)in_stack_ffffffffffffec58),
         bVar1)) {
        local_84 = local_84 + 1;
        if (local_c <= local_84) {
          local_41 = 1;
          goto LAB_00161a81;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffeca0,in_stack_ffffffffffffec98,
                   (allocator<char> *)
                   CONCAT17(in_stack_ffffffffffffec97,
                            CONCAT16(in_stack_ffffffffffffec96,
                                     CONCAT15(in_stack_ffffffffffffec95,
                                              CONCAT14(in_stack_ffffffffffffec94,
                                                       in_stack_ffffffffffffec90)))));
        string_split<int>(in_stack_ffffffffffffefb8,in_stack_ffffffffffffefb7);
        std::__cxx11::string::~string(local_1a8);
        std::allocator<char>::~allocator(&local_1a9);
        local_1c0 = (int *)std::vector<int,_std::allocator<int>_>::end
                                     ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffec58
                                     );
        __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
        __normal_iterator<int*>
                  ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                   in_stack_ffffffffffffec60,
                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                   in_stack_ffffffffffffec58);
        local_1c8 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                     ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffec58
                                     );
        local_1d0 = (int *)std::vector<int,_std::allocator<int>_>::end
                                     ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffec58
                                     );
        __last_01._M_current._2_1_ = in_stack_ffffffffffffecaa;
        __last_01._M_current._0_2_ = in_stack_ffffffffffffeca8;
        __last_01._M_current._3_1_ = in_stack_ffffffffffffecab;
        __last_01._M_current._4_4_ = in_stack_ffffffffffffecac;
        local_1d8 = (int *)std::vector<int,std::allocator<int>>::
                           insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                                     ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffeca0
                                      ,(const_iterator)in_stack_ffffffffffffecb8._M_current,
                                      (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                       )in_stack_ffffffffffffecb0._M_current,__last_01);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffec70._M_current);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_ffffffffffffec60,(char *)in_stack_ffffffffffffec58);
        if (bVar1) {
          local_84 = local_84 + 1;
          if (local_84 < local_c) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_ffffffffffffeca0,in_stack_ffffffffffffec98,
                       (allocator<char> *)
                       CONCAT17(in_stack_ffffffffffffec97,
                                CONCAT16(in_stack_ffffffffffffec96,
                                         CONCAT15(in_stack_ffffffffffffec95,
                                                  CONCAT14(in_stack_ffffffffffffec94,
                                                           in_stack_ffffffffffffec90)))));
            string_split<std::__cxx11::string>
                      ((string *)in_stack_ffffffffffffecc8._M_current,
                       (char)(in_stack_ffffffffffffecc4 >> 0x18));
            std::__cxx11::string::~string(local_210);
            std::allocator<char>::~allocator(&local_211);
            sVar5 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(&local_1f0);
            if (sVar5 == 2) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](&local_1f0,0);
              local_224 = std::__cxx11::stoi((string *)in_stack_ffffffffffffec60,
                                             (size_t *)in_stack_ffffffffffffec58,0);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](&local_1f0,1);
              local_228 = std::__cxx11::stoi((string *)in_stack_ffffffffffffec60,
                                             (size_t *)in_stack_ffffffffffffec58,0);
              std::pair<int,_int>::pair<int,_int,_true>(&local_220,&local_224,&local_228);
              std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                        ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                         in_stack_ffffffffffffec60,(value_type *)in_stack_ffffffffffffec58);
              local_218 = 0;
            }
            else {
              local_41 = 1;
              local_218 = 2;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffec70._M_current);
            goto joined_r0x0015e1f0;
          }
          local_41 = 1;
          goto LAB_00161a81;
        }
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_ffffffffffffec60,(char *)in_stack_ffffffffffffec58);
        if ((bVar1) ||
           (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_ffffffffffffec60,(char *)in_stack_ffffffffffffec58),
           bVar1)) {
          local_84 = local_84 + 1;
          if (local_c <= local_84) {
            local_41 = 1;
            goto LAB_00161a81;
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffeca0,in_stack_ffffffffffffec98,
                     (allocator<char> *)
                     CONCAT17(in_stack_ffffffffffffec97,
                              CONCAT16(in_stack_ffffffffffffec96,
                                       CONCAT15(in_stack_ffffffffffffec95,
                                                CONCAT14(in_stack_ffffffffffffec94,
                                                         in_stack_ffffffffffffec90)))));
          string_split<int>(in_stack_ffffffffffffefb8,in_stack_ffffffffffffefb7);
          std::__cxx11::string::~string(local_260);
          std::allocator<char>::~allocator(&local_261);
          local_278 = (int *)std::vector<int,_std::allocator<int>_>::end
                                       ((vector<int,_std::allocator<int>_> *)
                                        in_stack_ffffffffffffec58);
          __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
          __normal_iterator<int*>
                    ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     in_stack_ffffffffffffec60,
                     (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     in_stack_ffffffffffffec58);
          local_280 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                       ((vector<int,_std::allocator<int>_> *)
                                        in_stack_ffffffffffffec58);
          local_288 = (int *)std::vector<int,_std::allocator<int>_>::end
                                       ((vector<int,_std::allocator<int>_> *)
                                        in_stack_ffffffffffffec58);
          __last_02._M_current._2_1_ = in_stack_ffffffffffffecaa;
          __last_02._M_current._0_2_ = in_stack_ffffffffffffeca8;
          __last_02._M_current._3_1_ = in_stack_ffffffffffffecab;
          __last_02._M_current._4_4_ = in_stack_ffffffffffffecac;
          local_290 = (int *)std::vector<int,std::allocator<int>>::
                             insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                                       ((vector<int,_std::allocator<int>_> *)
                                        in_stack_ffffffffffffeca0,
                                        (const_iterator)in_stack_ffffffffffffecb8._M_current,
                                        (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                         )in_stack_ffffffffffffecb0._M_current,__last_02);
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffec70._M_current);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_ffffffffffffec60,(char *)in_stack_ffffffffffffec58);
          if ((bVar1) ||
             (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_ffffffffffffec60,(char *)in_stack_ffffffffffffec58
                                     ), bVar1)) {
            local_84 = local_84 + 1;
            if (local_c <= local_84) {
              local_41 = 1;
              goto LAB_00161a81;
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_ffffffffffffeca0,in_stack_ffffffffffffec98,
                       (allocator<char> *)
                       CONCAT17(in_stack_ffffffffffffec97,
                                CONCAT16(in_stack_ffffffffffffec96,
                                         CONCAT15(in_stack_ffffffffffffec95,
                                                  CONCAT14(in_stack_ffffffffffffec94,
                                                           in_stack_ffffffffffffec90)))));
            string_split<int>(in_stack_ffffffffffffefb8,in_stack_ffffffffffffefb7);
            std::__cxx11::string::~string(local_2c8);
            std::allocator<char>::~allocator(&local_2c9);
            local_2e0 = (int *)std::vector<int,_std::allocator<int>_>::end
                                         ((vector<int,_std::allocator<int>_> *)
                                          in_stack_ffffffffffffec58);
            __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
            __normal_iterator<int*>
                      ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffec60,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffec58);
            local_2e8 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                         ((vector<int,_std::allocator<int>_> *)
                                          in_stack_ffffffffffffec58);
            local_2f0 = (int *)std::vector<int,_std::allocator<int>_>::end
                                         ((vector<int,_std::allocator<int>_> *)
                                          in_stack_ffffffffffffec58);
            __last_03._M_current._2_1_ = in_stack_ffffffffffffecaa;
            __last_03._M_current._0_2_ = in_stack_ffffffffffffeca8;
            __last_03._M_current._3_1_ = in_stack_ffffffffffffecab;
            __last_03._M_current._4_4_ = in_stack_ffffffffffffecac;
            local_2f8 = (int *)std::vector<int,std::allocator<int>>::
                               insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                                         ((vector<int,_std::allocator<int>_> *)
                                          in_stack_ffffffffffffeca0,
                                          (const_iterator)in_stack_ffffffffffffecb8._M_current,
                                          (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                           )in_stack_ffffffffffffecb0._M_current,__last_03);
            std::vector<int,_std::allocator<int>_>::~vector
                      ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffec70._M_current);
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_ffffffffffffec60,(char *)in_stack_ffffffffffffec58);
            if ((bVar1) ||
               (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)in_stack_ffffffffffffec60,
                                        (char *)in_stack_ffffffffffffec58), bVar1)) {
              local_84 = local_84 + 1;
              if (local_c <= local_84) {
                local_41 = 1;
                goto LAB_00161a81;
              }
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_ffffffffffffeca0,in_stack_ffffffffffffec98,
                         (allocator<char> *)
                         CONCAT17(in_stack_ffffffffffffec97,
                                  CONCAT16(in_stack_ffffffffffffec96,
                                           CONCAT15(in_stack_ffffffffffffec95,
                                                    CONCAT14(in_stack_ffffffffffffec94,
                                                             in_stack_ffffffffffffec90)))));
              string_split<std::__cxx11::string>
                        ((string *)in_stack_ffffffffffffecc8._M_current,
                         (char)(in_stack_ffffffffffffecc4 >> 0x18));
              std::__cxx11::string::~string(local_330);
              std::allocator<char>::~allocator(&local_331);
              std::vector<ggml_type,_std::allocator<ggml_type>_>::vector
                        ((vector<ggml_type,_std::allocator<ggml_type>_> *)0x15e78d);
              local_358 = local_310;
              local_360._M_current =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)in_stack_ffffffffffffec58);
              local_368 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)in_stack_ffffffffffffec58);
              while (bVar1 = __gnu_cxx::operator!=
                                       ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)in_stack_ffffffffffffec60,
                                        (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)in_stack_ffffffffffffec58), bVar1) {
                local_370 = __gnu_cxx::
                            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator*(&local_360);
                local_374 = ggml_type_from_name(in_stack_ffffffffffffec58);
                if (local_374 == GGML_TYPE_COUNT) {
                  local_41 = 1;
                  break;
                }
                std::vector<ggml_type,_std::allocator<ggml_type>_>::push_back
                          ((vector<ggml_type,_std::allocator<ggml_type>_> *)
                           in_stack_ffffffffffffec70._M_current,
                           (value_type *)in_stack_ffffffffffffec68._M_current);
                __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator++(&local_360);
              }
              if ((local_41 & 1) == 0) {
                local_388 = (ggml_type *)
                            std::vector<ggml_type,_std::allocator<ggml_type>_>::end
                                      ((vector<ggml_type,_std::allocator<ggml_type>_> *)
                                       in_stack_ffffffffffffec58);
                __gnu_cxx::
                __normal_iterator<ggml_type_const*,std::vector<ggml_type,std::allocator<ggml_type>>>
                ::__normal_iterator<ggml_type*>
                          ((__normal_iterator<const_ggml_type_*,_std::vector<ggml_type,_std::allocator<ggml_type>_>_>
                            *)in_stack_ffffffffffffec60,
                           (__normal_iterator<ggml_type_*,_std::vector<ggml_type,_std::allocator<ggml_type>_>_>
                            *)in_stack_ffffffffffffec58);
                local_390 = (ggml_type *)
                            std::vector<ggml_type,_std::allocator<ggml_type>_>::begin
                                      ((vector<ggml_type,_std::allocator<ggml_type>_> *)
                                       in_stack_ffffffffffffec58);
                local_398 = (ggml_type *)
                            std::vector<ggml_type,_std::allocator<ggml_type>_>::end
                                      ((vector<ggml_type,_std::allocator<ggml_type>_> *)
                                       in_stack_ffffffffffffec58);
                __last_04._M_current._2_1_ = in_stack_ffffffffffffecaa;
                __last_04._M_current._0_2_ = in_stack_ffffffffffffeca8;
                __last_04._M_current._3_1_ = in_stack_ffffffffffffecab;
                __last_04._M_current._4_4_ = in_stack_ffffffffffffecac;
                local_3a0 = (ggml_type *)
                            std::vector<ggml_type,std::allocator<ggml_type>>::
                            insert<__gnu_cxx::__normal_iterator<ggml_type*,std::vector<ggml_type,std::allocator<ggml_type>>>,void>
                                      ((vector<ggml_type,_std::allocator<ggml_type>_> *)
                                       in_stack_ffffffffffffeca0,
                                       (const_iterator)in_stack_ffffffffffffecb8._M_current,
                                       (__normal_iterator<ggml_type_*,_std::vector<ggml_type,_std::allocator<ggml_type>_>_>
                                        )in_stack_ffffffffffffecb0._M_current,__last_04);
                local_218 = 0;
              }
              else {
                local_218 = 2;
              }
              std::vector<ggml_type,_std::allocator<ggml_type>_>::~vector
                        ((vector<ggml_type,_std::allocator<ggml_type>_> *)
                         in_stack_ffffffffffffec70._M_current);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_ffffffffffffec70._M_current);
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_ffffffffffffec60,(char *)in_stack_ffffffffffffec58
                                     );
              if ((!bVar1) &&
                 (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)in_stack_ffffffffffffec60,
                                          (char *)in_stack_ffffffffffffec58), !bVar1)) {
                in_stack_ffffffffffffefb7 =
                     std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)in_stack_ffffffffffffec60,(char *)in_stack_ffffffffffffec58)
                ;
                if (((bool)in_stack_ffffffffffffefb7) ||
                   (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)in_stack_ffffffffffffec60,
                                            (char *)in_stack_ffffffffffffec58), bVar1)) {
                  local_84 = local_84 + 1;
                  if (local_c <= local_84) {
                    local_41 = 1;
                    goto LAB_00161a81;
                  }
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            (in_stack_ffffffffffffeca0,in_stack_ffffffffffffec98,
                             (allocator<char> *)
                             CONCAT17(in_stack_ffffffffffffec97,
                                      CONCAT16(in_stack_ffffffffffffec96,
                                               CONCAT15(in_stack_ffffffffffffec95,
                                                        CONCAT14(in_stack_ffffffffffffec94,
                                                                 in_stack_ffffffffffffec90)))));
                  string_split<int>(in_stack_ffffffffffffefb8,in_stack_ffffffffffffefb7);
                  std::__cxx11::string::~string(local_480);
                  std::allocator<char>::~allocator(&local_481);
                  local_498 = (int *)std::vector<int,_std::allocator<int>_>::end
                                               ((vector<int,_std::allocator<int>_> *)
                                                in_stack_ffffffffffffec58);
                  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
                  __normal_iterator<int*>
                            ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                              *)in_stack_ffffffffffffec60,
                             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             in_stack_ffffffffffffec58);
                  local_4a0 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                               ((vector<int,_std::allocator<int>_> *)
                                                in_stack_ffffffffffffec58);
                  local_4a8 = (int *)std::vector<int,_std::allocator<int>_>::end
                                               ((vector<int,_std::allocator<int>_> *)
                                                in_stack_ffffffffffffec58);
                  __last_06._M_current._2_1_ = in_stack_ffffffffffffecaa;
                  __last_06._M_current._0_2_ = in_stack_ffffffffffffeca8;
                  __last_06._M_current._3_1_ = in_stack_ffffffffffffecab;
                  __last_06._M_current._4_4_ = in_stack_ffffffffffffecac;
                  local_4b0 = (int *)std::vector<int,std::allocator<int>>::
                                     insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                                               ((vector<int,_std::allocator<int>_> *)
                                                in_stack_ffffffffffffeca0,
                                                (const_iterator)in_stack_ffffffffffffecb8._M_current
                                                ,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                                  )in_stack_ffffffffffffecb0._M_current,__last_06);
                  std::vector<int,_std::allocator<int>_>::~vector
                            ((vector<int,_std::allocator<int>_> *)
                             in_stack_ffffffffffffec70._M_current);
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)in_stack_ffffffffffffec60,
                                          (char *)in_stack_ffffffffffffec58);
                  if ((bVar1) ||
                     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)in_stack_ffffffffffffec60,
                                              (char *)in_stack_ffffffffffffec58), bVar1)) {
                    local_84 = local_84 + 1;
                    if (local_c <= local_84) {
                      local_41 = 1;
                      goto LAB_00161a81;
                    }
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              (in_stack_ffffffffffffeca0,in_stack_ffffffffffffec98,
                               (allocator<char> *)
                               CONCAT17(in_stack_ffffffffffffec97,
                                        CONCAT16(in_stack_ffffffffffffec96,
                                                 CONCAT15(in_stack_ffffffffffffec95,
                                                          CONCAT14(in_stack_ffffffffffffec94,
                                                                   in_stack_ffffffffffffec90)))));
                    string_split<std::__cxx11::string>
                              ((string *)in_stack_ffffffffffffecc8._M_current,
                               (char)(in_stack_ffffffffffffecc4 >> 0x18));
                    std::__cxx11::string::~string(local_4e8);
                    std::allocator<char>::~allocator(&local_4e9);
                    local_500 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )std::
                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)in_stack_ffffffffffffec58);
                    __gnu_cxx::
                    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ::__normal_iterator<std::__cxx11::string*>
                              ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)in_stack_ffffffffffffec60,
                               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)in_stack_ffffffffffffec58);
                    local_508 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )std::
                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)in_stack_ffffffffffffec58);
                    local_510 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )std::
                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)in_stack_ffffffffffffec58);
                    __last_07._M_current._2_1_ = in_stack_ffffffffffffecaa;
                    __last_07._M_current._0_2_ = in_stack_ffffffffffffeca8;
                    __last_07._M_current._3_1_ = in_stack_ffffffffffffecab;
                    __last_07._M_current._4_4_ = in_stack_ffffffffffffecac;
                    local_518 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )std::
                                 vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                                 insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                                           ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)in_stack_ffffffffffffeca0,in_stack_ffffffffffffecb8,
                                            in_stack_ffffffffffffecb0,__last_07);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)in_stack_ffffffffffffec70._M_current);
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)in_stack_ffffffffffffec60,
                                            (char *)in_stack_ffffffffffffec58);
                    if (bVar1) {
                      local_84 = local_84 + 1;
                      if (local_c <= local_84) {
                        local_41 = 1;
                        goto LAB_00161a81;
                      }
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                (in_stack_ffffffffffffeca0,in_stack_ffffffffffffec98,
                                 (allocator<char> *)
                                 CONCAT17(in_stack_ffffffffffffec97,
                                          CONCAT16(in_stack_ffffffffffffec96,
                                                   CONCAT15(in_stack_ffffffffffffec95,
                                                            CONCAT14(in_stack_ffffffffffffec94,
                                                                     in_stack_ffffffffffffec90)))));
                      string_split<bool>(in_stack_ffffffffffffefb8,in_stack_ffffffffffffefb7);
                      std::__cxx11::string::~string(local_560);
                      std::allocator<char>::~allocator(&local_561);
                      iVar10 = std::vector<bool,_std::allocator<bool>_>::end(&in_RDI->cpu_strict);
                      local_598 = iVar10.super__Bit_iterator_base._M_p;
                      local_590 = iVar10.super__Bit_iterator_base._M_offset;
                      local_588 = local_598;
                      local_580 = local_590;
                      std::_Bit_const_iterator::_Bit_const_iterator
                                ((_Bit_const_iterator *)in_stack_ffffffffffffec60,
                                 (_Bit_iterator *)in_stack_ffffffffffffec58);
                      iVar10 = std::vector<bool,_std::allocator<bool>_>::begin
                                         ((vector<bool,_std::allocator<bool>_> *)0x15f2f1);
                      local_5b8 = iVar10.super__Bit_iterator_base._M_p;
                      local_5b0 = iVar10.super__Bit_iterator_base._M_offset;
                      local_5a8 = local_5b8;
                      local_5a0 = local_5b0;
                      iVar10 = std::vector<bool,_std::allocator<bool>_>::end(&local_540);
                      in_stack_ffffffffffffec58 = (string *)iVar10.super__Bit_iterator_base._M_p;
                      local_5d0 = iVar10.super__Bit_iterator_base._M_offset;
                      in_stack_ffffffffffffec60 = (cmd_params *)CONCAT44(uStack_5bc,local_5d0);
                      __position.super__Bit_iterator_base._8_8_ = in_stack_ffffffffffffed40;
                      __position.super__Bit_iterator_base._M_p =
                           (_Bit_type *)in_stack_ffffffffffffed38;
                      __first.super__Bit_iterator_base._8_8_ = in_stack_ffffffffffffed30;
                      __first.super__Bit_iterator_base._M_p = (_Bit_type *)in_stack_ffffffffffffed28
                      ;
                      __last_11.super__Bit_iterator_base._M_p._4_4_ = in_stack_ffffffffffffed64;
                      __last_11.super__Bit_iterator_base._M_p._0_4_ = in_stack_ffffffffffffed60;
                      __last_11.super__Bit_iterator_base._8_8_ = in_stack_ffffffffffffed68;
                      local_5d8 = in_stack_ffffffffffffec58;
                      local_5c8 = in_stack_ffffffffffffec58;
                      uStack_5c0 = local_5d0;
                      iVar11 = std::vector<bool,std::allocator<bool>>::
                               insert<std::_Bit_iterator,void>
                                         (in_stack_ffffffffffffed20,__position,__first,__last_11);
                      local_5e8 = iVar11.super__Bit_iterator_base._M_p;
                      local_5e0 = iVar11.super__Bit_iterator_base._M_offset;
                      std::vector<bool,_std::allocator<bool>_>::~vector
                                ((vector<bool,_std::allocator<bool>_> *)0x15f3ce);
                    }
                    else {
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)in_stack_ffffffffffffec60,
                                              (char *)in_stack_ffffffffffffec58);
                      if (bVar1) {
                        local_84 = local_84 + 1;
                        if (local_c <= local_84) {
                          local_41 = 1;
                          goto LAB_00161a81;
                        }
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  (in_stack_ffffffffffffeca0,in_stack_ffffffffffffec98,
                                   (allocator<char> *)
                                   CONCAT17(in_stack_ffffffffffffec97,
                                            CONCAT16(in_stack_ffffffffffffec96,
                                                     CONCAT15(in_stack_ffffffffffffec95,
                                                              CONCAT14(in_stack_ffffffffffffec94,
                                                                       in_stack_ffffffffffffec90))))
                                  );
                        string_split<int>(in_stack_ffffffffffffefb8,in_stack_ffffffffffffefb7);
                        std::__cxx11::string::~string(local_620);
                        std::allocator<char>::~allocator(&local_621);
                        local_638 = (int *)std::vector<int,_std::allocator<int>_>::end
                                                     ((vector<int,_std::allocator<int>_> *)
                                                      in_stack_ffffffffffffec58);
                        __gnu_cxx::
                        __normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
                        __normal_iterator<int*>
                                  ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                    *)in_stack_ffffffffffffec60,
                                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                    *)in_stack_ffffffffffffec58);
                        local_640 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                                     ((vector<int,_std::allocator<int>_> *)
                                                      in_stack_ffffffffffffec58);
                        local_648 = (int *)std::vector<int,_std::allocator<int>_>::end
                                                     ((vector<int,_std::allocator<int>_> *)
                                                      in_stack_ffffffffffffec58);
                        __last_08._M_current._2_1_ = in_stack_ffffffffffffecaa;
                        __last_08._M_current._0_2_ = in_stack_ffffffffffffeca8;
                        __last_08._M_current._3_1_ = in_stack_ffffffffffffecab;
                        __last_08._M_current._4_4_ = in_stack_ffffffffffffecac;
                        local_650 = (int *)std::vector<int,std::allocator<int>>::
                                           insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                                                     ((vector<int,_std::allocator<int>_> *)
                                                      in_stack_ffffffffffffeca0,
                                                      (const_iterator)
                                                      in_stack_ffffffffffffecb8._M_current,
                                                      (
                                                  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                                  )in_stack_ffffffffffffecb0._M_current,__last_08);
                        std::vector<int,_std::allocator<int>_>::~vector
                                  ((vector<int,_std::allocator<int>_> *)
                                   in_stack_ffffffffffffec70._M_current);
                      }
                      else {
                        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)in_stack_ffffffffffffec60,
                                                (char *)in_stack_ffffffffffffec58);
                        if ((bVar1) ||
                           (bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_ffffffffffffec60,
                                                  (char *)in_stack_ffffffffffffec58), bVar1)) {
                          local_84 = local_84 + 1;
                          if (local_c <= local_84) {
                            local_41 = 1;
                            goto LAB_00161a81;
                          }
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    (in_stack_ffffffffffffeca0,in_stack_ffffffffffffec98,
                                     (allocator<char> *)
                                     CONCAT17(in_stack_ffffffffffffec97,
                                              CONCAT16(in_stack_ffffffffffffec96,
                                                       CONCAT15(in_stack_ffffffffffffec95,
                                                                CONCAT14(in_stack_ffffffffffffec94,
                                                                         in_stack_ffffffffffffec90))
                                                      )));
                          string_split<int>(in_stack_ffffffffffffefb8,in_stack_ffffffffffffefb7);
                          std::__cxx11::string::~string(local_688);
                          std::allocator<char>::~allocator(&local_689);
                          local_6a0 = (int *)std::vector<int,_std::allocator<int>_>::end
                                                       ((vector<int,_std::allocator<int>_> *)
                                                        in_stack_ffffffffffffec58);
                          __gnu_cxx::
                          __normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
                          __normal_iterator<int*>
                                    ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                      *)in_stack_ffffffffffffec60,
                                     (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                      *)in_stack_ffffffffffffec58);
                          local_6a8 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                                       ((vector<int,_std::allocator<int>_> *)
                                                        in_stack_ffffffffffffec58);
                          local_6b0 = (int *)std::vector<int,_std::allocator<int>_>::end
                                                       ((vector<int,_std::allocator<int>_> *)
                                                        in_stack_ffffffffffffec58);
                          __last_09._M_current._2_1_ = in_stack_ffffffffffffecaa;
                          __last_09._M_current._0_2_ = in_stack_ffffffffffffeca8;
                          __last_09._M_current._3_1_ = in_stack_ffffffffffffecab;
                          __last_09._M_current._4_4_ = in_stack_ffffffffffffecac;
                          local_6b8 = (int *)std::vector<int,std::allocator<int>>::
                                             insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                                                       ((vector<int,_std::allocator<int>_> *)
                                                        in_stack_ffffffffffffeca0,
                                                        (const_iterator)
                                                        in_stack_ffffffffffffecb8._M_current,
                                                        (
                                                  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                                  )in_stack_ffffffffffffecb0._M_current,__last_09);
                          std::vector<int,_std::allocator<int>_>::~vector
                                    ((vector<int,_std::allocator<int>_> *)
                                     in_stack_ffffffffffffec70._M_current);
                        }
                        else {
                          bVar2 = llama_supports_rpc();
                          if (((bVar2 & 1) != 0) &&
                             ((bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_ffffffffffffec60,
                                                  (char *)in_stack_ffffffffffffec58), bVar1 ||
                              (bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_ffffffffffffec60,
                                                  (char *)in_stack_ffffffffffffec58), bVar1)))) {
                            local_84 = local_84 + 1;
                            if (local_84 < local_c) {
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string<std::allocator<char>>
                                        (in_stack_ffffffffffffeca0,in_stack_ffffffffffffec98,
                                         (allocator<char> *)
                                         CONCAT17(in_stack_ffffffffffffec97,
                                                  CONCAT16(in_stack_ffffffffffffec96,
                                                           CONCAT15(in_stack_ffffffffffffec95,
                                                                    CONCAT14(
                                                  in_stack_ffffffffffffec94,
                                                  in_stack_ffffffffffffec90)))));
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::push_back(&in_stack_ffffffffffffec60->model,
                                          in_stack_ffffffffffffec58);
                              std::__cxx11::string::~string(local_6d8);
                              std::allocator<char>::~allocator(&local_6d9);
                              goto LAB_00161a67;
                            }
                            local_41 = 1;
                            goto LAB_00161a81;
                          }
                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_ffffffffffffec60,
                                                  (char *)in_stack_ffffffffffffec58);
                          if ((bVar1) ||
                             (bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_ffffffffffffec60,
                                                  (char *)in_stack_ffffffffffffec58), bVar1)) {
                            local_84 = local_84 + 1;
                            if (local_84 < local_c) {
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string<std::allocator<char>>
                                        (in_stack_ffffffffffffeca0,in_stack_ffffffffffffec98,
                                         (allocator<char> *)
                                         CONCAT17(in_stack_ffffffffffffec97,
                                                  CONCAT16(in_stack_ffffffffffffec96,
                                                           CONCAT15(in_stack_ffffffffffffec95,
                                                                    CONCAT14(
                                                  in_stack_ffffffffffffec94,
                                                  in_stack_ffffffffffffec90)))));
                              string_split<std::__cxx11::string>
                                        ((string *)in_stack_ffffffffffffecc8._M_current,
                                         (char)(in_stack_ffffffffffffecc4 >> 0x18));
                              std::__cxx11::string::~string(local_718);
                              std::allocator<char>::~allocator(&local_719);
                              std::vector<llama_split_mode,_std::allocator<llama_split_mode>_>::
                              vector((vector<llama_split_mode,_std::allocator<llama_split_mode>_> *)
                                     0x15fb08);
                              local_740 = local_6f8;
                              local_748._M_current =
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)std::
                                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               *)in_stack_ffffffffffffec58);
                              local_750 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)std::
                                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ::end((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)in_stack_ffffffffffffec58);
                              while (bVar1 = __gnu_cxx::operator!=
                                                       ((
                                                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)in_stack_ffffffffffffec60,
                                                  (
                                                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)in_stack_ffffffffffffec58), bVar1) {
                                local_758 = __gnu_cxx::
                                            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                            ::operator*(&local_748);
                                bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_ffffffffffffec60,
                                                  (char *)in_stack_ffffffffffffec58);
                                if (bVar1) {
                                  local_75c = 0;
                                }
                                else {
                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_ffffffffffffec60,
                                                  (char *)in_stack_ffffffffffffec58);
                                  if (bVar1) {
                                    local_75c = 1;
                                  }
                                  else {
                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_ffffffffffffec60,
                                                  (char *)in_stack_ffffffffffffec58);
                                    if (!bVar1) {
                                      local_41 = 1;
                                      break;
                                    }
                                    local_75c = 2;
                                  }
                                }
                                std::vector<llama_split_mode,_std::allocator<llama_split_mode>_>::
                                push_back((vector<llama_split_mode,_std::allocator<llama_split_mode>_>
                                           *)in_stack_ffffffffffffec70._M_current,
                                          (value_type *)in_stack_ffffffffffffec68._M_current);
                                __gnu_cxx::
                                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ::operator++(&local_748);
                              }
                              if ((local_41 & 1) == 0) {
                                local_770 = (llama_split_mode *)
                                            std::
                                            vector<llama_split_mode,_std::allocator<llama_split_mode>_>
                                            ::end((
                                                  vector<llama_split_mode,_std::allocator<llama_split_mode>_>
                                                  *)in_stack_ffffffffffffec58);
                                __gnu_cxx::
                                __normal_iterator<llama_split_mode_const*,std::vector<llama_split_mode,std::allocator<llama_split_mode>>>
                                ::__normal_iterator<llama_split_mode*>
                                          ((__normal_iterator<const_llama_split_mode_*,_std::vector<llama_split_mode,_std::allocator<llama_split_mode>_>_>
                                            *)in_stack_ffffffffffffec60,
                                           (__normal_iterator<llama_split_mode_*,_std::vector<llama_split_mode,_std::allocator<llama_split_mode>_>_>
                                            *)in_stack_ffffffffffffec58);
                                local_778 = (llama_split_mode *)
                                            std::
                                            vector<llama_split_mode,_std::allocator<llama_split_mode>_>
                                            ::begin((
                                                  vector<llama_split_mode,_std::allocator<llama_split_mode>_>
                                                  *)in_stack_ffffffffffffec58);
                                local_780 = (llama_split_mode *)
                                            std::
                                            vector<llama_split_mode,_std::allocator<llama_split_mode>_>
                                            ::end((
                                                  vector<llama_split_mode,_std::allocator<llama_split_mode>_>
                                                  *)in_stack_ffffffffffffec58);
                                __last_10._M_current._2_1_ = in_stack_ffffffffffffecaa;
                                __last_10._M_current._0_2_ = in_stack_ffffffffffffeca8;
                                __last_10._M_current._3_1_ = in_stack_ffffffffffffecab;
                                __last_10._M_current._4_4_ = in_stack_ffffffffffffecac;
                                local_788 = (llama_split_mode *)
                                            std::
                                            vector<llama_split_mode,std::allocator<llama_split_mode>>
                                            ::
                                            insert<__gnu_cxx::__normal_iterator<llama_split_mode*,std::vector<llama_split_mode,std::allocator<llama_split_mode>>>,void>
                                                      ((
                                                  vector<llama_split_mode,_std::allocator<llama_split_mode>_>
                                                  *)in_stack_ffffffffffffeca0,
                                                  (const_iterator)
                                                  in_stack_ffffffffffffecb8._M_current,
                                                  (
                                                  __normal_iterator<llama_split_mode_*,_std::vector<llama_split_mode,_std::allocator<llama_split_mode>_>_>
                                                  )in_stack_ffffffffffffecb0._M_current,__last_10);
                                local_218 = 0;
                              }
                              else {
                                local_218 = 2;
                              }
                              std::vector<llama_split_mode,_std::allocator<llama_split_mode>_>::
                              ~vector((vector<llama_split_mode,_std::allocator<llama_split_mode>_> *
                                      )in_stack_ffffffffffffec70._M_current);
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)in_stack_ffffffffffffec70._M_current);
                              goto joined_r0x0015e1f0;
                            }
                            local_41 = 1;
                            goto LAB_00161a81;
                          }
                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_ffffffffffffec60,
                                                  (char *)in_stack_ffffffffffffec58);
                          if ((bVar1) ||
                             (bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_ffffffffffffec60,
                                                  (char *)in_stack_ffffffffffffec58), bVar1)) {
                            local_84 = local_84 + 1;
                            if (local_c <= local_84) {
                              local_41 = 1;
                              goto LAB_00161a81;
                            }
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      (in_stack_ffffffffffffeca0,in_stack_ffffffffffffec98,
                                       (allocator<char> *)
                                       CONCAT17(in_stack_ffffffffffffec97,
                                                CONCAT16(in_stack_ffffffffffffec96,
                                                         CONCAT15(in_stack_ffffffffffffec95,
                                                                  CONCAT14(in_stack_ffffffffffffec94
                                                                           ,
                                                  in_stack_ffffffffffffec90)))));
                            string_split<int>(in_stack_ffffffffffffefb8,in_stack_ffffffffffffefb7);
                            std::vector<int,_std::allocator<int>_>::operator=
                                      ((vector<int,_std::allocator<int>_> *)
                                       in_stack_ffffffffffffec70._M_current,
                                       (vector<int,_std::allocator<int>_> *)
                                       in_stack_ffffffffffffec68._M_current);
                            std::vector<int,_std::allocator<int>_>::~vector
                                      ((vector<int,_std::allocator<int>_> *)
                                       in_stack_ffffffffffffec70._M_current);
                            std::__cxx11::string::~string(local_7c0);
                            std::allocator<char>::~allocator(&local_7c1);
                          }
                          else {
                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_ffffffffffffec60,
                                                  (char *)in_stack_ffffffffffffec58);
                            if ((bVar1) ||
                               (bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_ffffffffffffec60,
                                                  (char *)in_stack_ffffffffffffec58), bVar1)) {
                              local_84 = local_84 + 1;
                              if (local_c <= local_84) {
                                local_41 = 1;
                                goto LAB_00161a81;
                              }
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string<std::allocator<char>>
                                        (in_stack_ffffffffffffeca0,in_stack_ffffffffffffec98,
                                         (allocator<char> *)
                                         CONCAT17(in_stack_ffffffffffffec97,
                                                  CONCAT16(in_stack_ffffffffffffec96,
                                                           CONCAT15(in_stack_ffffffffffffec95,
                                                                    CONCAT14(
                                                  in_stack_ffffffffffffec94,
                                                  in_stack_ffffffffffffec90)))));
                              string_split<bool>(in_stack_ffffffffffffefb8,in_stack_ffffffffffffefb7
                                                );
                              std::__cxx11::string::~string(local_810);
                              std::allocator<char>::~allocator(&local_811);
                              iVar10 = std::vector<bool,_std::allocator<bool>_>::end
                                                 (&in_RDI->no_kv_offload);
                              local_848 = iVar10.super__Bit_iterator_base._M_p;
                              local_840 = iVar10.super__Bit_iterator_base._M_offset;
                              local_838 = local_848;
                              local_830 = local_840;
                              std::_Bit_const_iterator::_Bit_const_iterator
                                        ((_Bit_const_iterator *)in_stack_ffffffffffffec60,
                                         (_Bit_iterator *)in_stack_ffffffffffffec58);
                              iVar10 = std::vector<bool,_std::allocator<bool>_>::begin
                                                 ((vector<bool,_std::allocator<bool>_> *)0x1600c9);
                              local_868 = iVar10.super__Bit_iterator_base._M_p;
                              local_860 = iVar10.super__Bit_iterator_base._M_offset;
                              local_858 = local_868;
                              local_850 = local_860;
                              iVar10 = std::vector<bool,_std::allocator<bool>_>::end(&local_7f0);
                              in_stack_ffffffffffffec58 =
                                   (string *)iVar10.super__Bit_iterator_base._M_p;
                              local_880 = iVar10.super__Bit_iterator_base._M_offset;
                              in_stack_ffffffffffffec60 =
                                   (cmd_params *)CONCAT44(uStack_86c,local_880);
                              __position_00.super__Bit_iterator_base._8_8_ =
                                   in_stack_ffffffffffffed40;
                              __position_00.super__Bit_iterator_base._M_p =
                                   (_Bit_type *)in_stack_ffffffffffffed38;
                              __first_00.super__Bit_iterator_base._8_8_ = in_stack_ffffffffffffed30;
                              __first_00.super__Bit_iterator_base._M_p =
                                   (_Bit_type *)in_stack_ffffffffffffed28;
                              __last_12.super__Bit_iterator_base._M_p._4_4_ =
                                   in_stack_ffffffffffffed64;
                              __last_12.super__Bit_iterator_base._M_p._0_4_ =
                                   in_stack_ffffffffffffed60;
                              __last_12.super__Bit_iterator_base._8_8_ = in_stack_ffffffffffffed68;
                              local_888 = in_stack_ffffffffffffec58;
                              local_878 = in_stack_ffffffffffffec58;
                              uStack_870 = local_880;
                              iVar11 = std::vector<bool,std::allocator<bool>>::
                                       insert<std::_Bit_iterator,void>
                                                 (in_stack_ffffffffffffed20,__position_00,__first_00
                                                  ,__last_12);
                              local_898 = iVar11.super__Bit_iterator_base._M_p;
                              local_890 = iVar11.super__Bit_iterator_base._M_offset;
                              std::vector<bool,_std::allocator<bool>_>::~vector
                                        ((vector<bool,_std::allocator<bool>_> *)0x1601a6);
                            }
                            else {
                              bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_ffffffffffffec60,
                                                  (char *)in_stack_ffffffffffffec58);
                              if (bVar1) {
                                local_84 = local_84 + 1;
                                if (local_84 < local_c) {
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string<std::allocator<char>>
                                            (in_stack_ffffffffffffeca0,in_stack_ffffffffffffec98,
                                             (allocator<char> *)
                                             CONCAT17(in_stack_ffffffffffffec97,
                                                      CONCAT16(in_stack_ffffffffffffec96,
                                                               CONCAT15(in_stack_ffffffffffffec95,
                                                                        CONCAT14(
                                                  in_stack_ffffffffffffec94,
                                                  in_stack_ffffffffffffec90)))));
                                  std::allocator<char>::~allocator(&local_8b9);
                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_ffffffffffffec60,
                                                  (char *)in_stack_ffffffffffffec58);
                                  if ((bVar1) ||
                                     (bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_ffffffffffffec60,
                                                  (char *)in_stack_ffffffffffffec58), bVar1)) {
                                    in_RDI->numa = GGML_NUMA_STRATEGY_DISTRIBUTE;
LAB_00160417:
                                    local_218 = 0;
                                  }
                                  else {
                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_ffffffffffffec60,
                                                  (char *)in_stack_ffffffffffffec58);
                                    if (bVar1) {
                                      in_RDI->numa = GGML_NUMA_STRATEGY_ISOLATE;
                                      goto LAB_00160417;
                                    }
                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_ffffffffffffec60,
                                                  (char *)in_stack_ffffffffffffec58);
                                    if (bVar1) {
                                      in_RDI->numa = GGML_NUMA_STRATEGY_NUMACTL;
                                      goto LAB_00160417;
                                    }
                                    local_41 = 1;
                                    local_218 = 2;
                                  }
                                  std::__cxx11::string::~string(local_8b8);
                                  goto joined_r0x0015e1f0;
                                }
                                local_41 = 1;
                                goto LAB_00161a81;
                              }
                              bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_ffffffffffffec60,
                                                  (char *)in_stack_ffffffffffffec58);
                              if ((bVar1) ||
                                 (bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_ffffffffffffec60,
                                                  (char *)in_stack_ffffffffffffec58), bVar1)) {
                                local_84 = local_84 + 1;
                                if (local_c <= local_84) {
                                  local_41 = 1;
                                  goto LAB_00161a81;
                                }
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string<std::allocator<char>>
                                          (in_stack_ffffffffffffeca0,in_stack_ffffffffffffec98,
                                           (allocator<char> *)
                                           CONCAT17(in_stack_ffffffffffffec97,
                                                    CONCAT16(in_stack_ffffffffffffec96,
                                                             CONCAT15(in_stack_ffffffffffffec95,
                                                                      CONCAT14(
                                                  in_stack_ffffffffffffec94,
                                                  in_stack_ffffffffffffec90)))));
                                string_split<bool>(in_stack_ffffffffffffefb8,
                                                   in_stack_ffffffffffffefb7);
                                std::__cxx11::string::~string(local_908);
                                std::allocator<char>::~allocator(&local_909);
                                iVar10 = std::vector<bool,_std::allocator<bool>_>::end
                                                   (&in_RDI->flash_attn);
                                local_940 = iVar10.super__Bit_iterator_base._M_p;
                                local_938 = iVar10.super__Bit_iterator_base._M_offset;
                                local_930 = local_940;
                                local_928 = local_938;
                                std::_Bit_const_iterator::_Bit_const_iterator
                                          ((_Bit_const_iterator *)in_stack_ffffffffffffec60,
                                           (_Bit_iterator *)in_stack_ffffffffffffec58);
                                iVar10 = std::vector<bool,_std::allocator<bool>_>::begin
                                                   ((vector<bool,_std::allocator<bool>_> *)0x1605c1)
                                ;
                                local_960 = iVar10.super__Bit_iterator_base._M_p;
                                local_958 = iVar10.super__Bit_iterator_base._M_offset;
                                local_950 = local_960;
                                local_948 = local_958;
                                iVar10 = std::vector<bool,_std::allocator<bool>_>::end(&local_8e8);
                                in_stack_ffffffffffffec58 =
                                     (string *)iVar10.super__Bit_iterator_base._M_p;
                                local_978 = iVar10.super__Bit_iterator_base._M_offset;
                                in_stack_ffffffffffffec60 =
                                     (cmd_params *)CONCAT44(uStack_964,local_978);
                                __position_01.super__Bit_iterator_base._8_8_ =
                                     in_stack_ffffffffffffed40;
                                __position_01.super__Bit_iterator_base._M_p =
                                     (_Bit_type *)in_stack_ffffffffffffed38;
                                __first_01.super__Bit_iterator_base._8_8_ =
                                     in_stack_ffffffffffffed30;
                                __first_01.super__Bit_iterator_base._M_p =
                                     (_Bit_type *)in_stack_ffffffffffffed28;
                                __last_13.super__Bit_iterator_base._M_p._4_4_ =
                                     in_stack_ffffffffffffed64;
                                __last_13.super__Bit_iterator_base._M_p._0_4_ =
                                     in_stack_ffffffffffffed60;
                                __last_13.super__Bit_iterator_base._8_8_ = in_stack_ffffffffffffed68
                                ;
                                local_980 = in_stack_ffffffffffffec58;
                                local_970 = in_stack_ffffffffffffec58;
                                uStack_968 = local_978;
                                iVar11 = std::vector<bool,std::allocator<bool>>::
                                         insert<std::_Bit_iterator,void>
                                                   (in_stack_ffffffffffffed20,__position_01,
                                                    __first_01,__last_13);
                                local_990 = iVar11.super__Bit_iterator_base._M_p;
                                local_988 = iVar11.super__Bit_iterator_base._M_offset;
                                std::vector<bool,_std::allocator<bool>_>::~vector
                                          ((vector<bool,_std::allocator<bool>_> *)0x16069e);
                              }
                              else {
                                bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_ffffffffffffec60,
                                                  (char *)in_stack_ffffffffffffec58);
                                if ((bVar1) ||
                                   (bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_ffffffffffffec60,
                                                  (char *)in_stack_ffffffffffffec58), bVar1)) {
                                  local_84 = local_84 + 1;
                                  if (local_c <= local_84) {
                                    local_41 = 1;
                                    goto LAB_00161a81;
                                  }
                                  in_stack_ffffffffffffedb0 =
                                       *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         **)(local_18 + (long)local_84 * 8);
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string<std::allocator<char>>
                                            (in_stack_ffffffffffffeca0,in_stack_ffffffffffffec98,
                                             (allocator<char> *)
                                             CONCAT17(in_stack_ffffffffffffec97,
                                                      CONCAT16(in_stack_ffffffffffffec96,
                                                               CONCAT15(in_stack_ffffffffffffec95,
                                                                        CONCAT14(
                                                  in_stack_ffffffffffffec94,
                                                  in_stack_ffffffffffffec90)))));
                                  string_split<bool>(in_stack_ffffffffffffefb8,
                                                     in_stack_ffffffffffffefb7);
                                  std::__cxx11::string::~string(local_9d8);
                                  std::allocator<char>::~allocator(&local_9d9);
                                  in_stack_ffffffffffffeda8 =
                                       (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                                        *)&in_RDI->use_mmap;
                                  iVar10 = std::vector<bool,_std::allocator<bool>_>::end
                                                     ((vector<bool,_std::allocator<bool>_> *)
                                                      in_stack_ffffffffffffeda8);
                                  local_a10 = iVar10.super__Bit_iterator_base._M_p;
                                  local_a08 = iVar10.super__Bit_iterator_base._M_offset;
                                  local_a00 = local_a10;
                                  local_9f8 = local_a08;
                                  std::_Bit_const_iterator::_Bit_const_iterator
                                            ((_Bit_const_iterator *)in_stack_ffffffffffffec60,
                                             (_Bit_iterator *)in_stack_ffffffffffffec58);
                                  iVar10 = std::vector<bool,_std::allocator<bool>_>::begin
                                                     ((vector<bool,_std::allocator<bool>_> *)
                                                      0x16088b);
                                  local_a30 = iVar10.super__Bit_iterator_base._M_p;
                                  local_a28 = iVar10.super__Bit_iterator_base._M_offset;
                                  local_a20 = local_a30;
                                  local_a18 = local_a28;
                                  iVar10 = std::vector<bool,_std::allocator<bool>_>::end(&local_9b8)
                                  ;
                                  in_stack_ffffffffffffec58 =
                                       (string *)iVar10.super__Bit_iterator_base._M_p;
                                  local_a48 = iVar10.super__Bit_iterator_base._M_offset;
                                  in_stack_ffffffffffffec60 =
                                       (cmd_params *)CONCAT44(uStack_a34,local_a48);
                                  __position_02.super__Bit_iterator_base._8_8_ =
                                       in_stack_ffffffffffffed40;
                                  __position_02.super__Bit_iterator_base._M_p =
                                       (_Bit_type *)in_stack_ffffffffffffed38;
                                  __first_02.super__Bit_iterator_base._8_8_ =
                                       in_stack_ffffffffffffed30;
                                  __first_02.super__Bit_iterator_base._M_p =
                                       (_Bit_type *)in_stack_ffffffffffffed28;
                                  __last_14.super__Bit_iterator_base._M_p._4_4_ =
                                       in_stack_ffffffffffffed64;
                                  __last_14.super__Bit_iterator_base._M_p._0_4_ =
                                       in_stack_ffffffffffffed60;
                                  __last_14.super__Bit_iterator_base._8_8_ =
                                       in_stack_ffffffffffffed68;
                                  local_a50 = in_stack_ffffffffffffec58;
                                  local_a40 = in_stack_ffffffffffffec58;
                                  uStack_a38 = local_a48;
                                  iVar11 = std::vector<bool,std::allocator<bool>>::
                                           insert<std::_Bit_iterator,void>
                                                     (in_stack_ffffffffffffed20,__position_02,
                                                      __first_02,__last_14);
                                  in_stack_ffffffffffffeda0 =
                                       (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                                        *)iVar11.super__Bit_iterator_base._M_p;
                                  in_stack_ffffffffffffed9c =
                                       iVar11.super__Bit_iterator_base._M_offset;
                                  local_a60 = in_stack_ffffffffffffeda0;
                                  local_a58 = in_stack_ffffffffffffed9c;
                                  std::vector<bool,_std::allocator<bool>_>::~vector
                                            ((vector<bool,_std::allocator<bool>_> *)0x160968);
                                }
                                else {
                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_ffffffffffffec60,
                                                  (char *)in_stack_ffffffffffffec58);
                                  if ((bVar1) ||
                                     (bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_ffffffffffffec60,
                                                  (char *)in_stack_ffffffffffffec58), bVar1)) {
                                    local_84 = local_84 + 1;
                                    if (local_c <= local_84) {
                                      local_41 = 1;
                                      goto LAB_00161a81;
                                    }
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string<std::allocator<char>>
                                              (in_stack_ffffffffffffeca0,in_stack_ffffffffffffec98,
                                               (allocator<char> *)
                                               CONCAT17(in_stack_ffffffffffffec97,
                                                        CONCAT16(in_stack_ffffffffffffec96,
                                                                 CONCAT15(in_stack_ffffffffffffec95,
                                                                          CONCAT14(
                                                  in_stack_ffffffffffffec94,
                                                  in_stack_ffffffffffffec90)))));
                                    string_split<bool>(in_stack_ffffffffffffefb8,
                                                       in_stack_ffffffffffffefb7);
                                    std::__cxx11::string::~string(local_aa8);
                                    std::allocator<char>::~allocator(&local_aa9);
                                    iVar10 = std::vector<bool,_std::allocator<bool>_>::end
                                                       (&in_RDI->embeddings);
                                    local_ae0 = iVar10.super__Bit_iterator_base._M_p;
                                    local_ad8 = iVar10.super__Bit_iterator_base._M_offset;
                                    local_ad0 = local_ae0;
                                    local_ac8 = local_ad8;
                                    std::_Bit_const_iterator::_Bit_const_iterator
                                              ((_Bit_const_iterator *)in_stack_ffffffffffffec60,
                                               (_Bit_iterator *)in_stack_ffffffffffffec58);
                                    iVar10 = std::vector<bool,_std::allocator<bool>_>::begin
                                                       ((vector<bool,_std::allocator<bool>_> *)
                                                        0x160b55);
                                    local_b00 = iVar10.super__Bit_iterator_base._M_p;
                                    local_af8 = iVar10.super__Bit_iterator_base._M_offset;
                                    local_af0 = local_b00;
                                    local_ae8 = local_af8;
                                    iVar10 = std::vector<bool,_std::allocator<bool>_>::end
                                                       (&local_a88);
                                    in_stack_ffffffffffffec58 =
                                         (string *)iVar10.super__Bit_iterator_base._M_p;
                                    local_b18 = iVar10.super__Bit_iterator_base._M_offset;
                                    in_stack_ffffffffffffec60 =
                                         (cmd_params *)CONCAT44(uStack_b04,local_b18);
                                    __position_03.super__Bit_iterator_base._8_8_ =
                                         in_stack_ffffffffffffed40;
                                    __position_03.super__Bit_iterator_base._M_p =
                                         (_Bit_type *)in_stack_ffffffffffffed38;
                                    __first_03.super__Bit_iterator_base._8_8_ =
                                         in_stack_ffffffffffffed30;
                                    __first_03.super__Bit_iterator_base._M_p =
                                         (_Bit_type *)in_stack_ffffffffffffed28;
                                    __last_15.super__Bit_iterator_base._M_p._4_4_ =
                                         in_stack_ffffffffffffed64;
                                    __last_15.super__Bit_iterator_base._M_p._0_4_ =
                                         in_stack_ffffffffffffed60;
                                    __last_15.super__Bit_iterator_base._8_8_ =
                                         in_stack_ffffffffffffed68;
                                    local_b20 = in_stack_ffffffffffffec58;
                                    local_b10 = in_stack_ffffffffffffec58;
                                    uStack_b08 = local_b18;
                                    iVar11 = std::vector<bool,std::allocator<bool>>::
                                             insert<std::_Bit_iterator,void>
                                                       (in_stack_ffffffffffffed20,__position_03,
                                                        __first_03,__last_15);
                                    in_stack_ffffffffffffed68 = iVar11.super__Bit_iterator_base._M_p
                                    ;
                                    in_stack_ffffffffffffed64 =
                                         iVar11.super__Bit_iterator_base._M_offset;
                                    local_b30 = in_stack_ffffffffffffed68;
                                    local_b28 = in_stack_ffffffffffffed64;
                                    std::vector<bool,_std::allocator<bool>_>::~vector
                                              ((vector<bool,_std::allocator<bool>_> *)0x160c32);
                                  }
                                  else {
                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_ffffffffffffec60,
                                                  (char *)in_stack_ffffffffffffec58);
                                    if ((bVar1) ||
                                       (bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_ffffffffffffec60,
                                                  (char *)in_stack_ffffffffffffec58), bVar1)) {
                                      local_84 = local_84 + 1;
                                      if (local_c <= local_84) {
                                        local_41 = 1;
                                        goto LAB_00161a81;
                                      }
                                      in_stack_ffffffffffffed40 =
                                           *(undefined8 *)(local_18 + (long)local_84 * 8);
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string<std::allocator<char>>
                                                (in_stack_ffffffffffffeca0,in_stack_ffffffffffffec98
                                                 ,(allocator<char> *)
                                                  CONCAT17(in_stack_ffffffffffffec97,
                                                           CONCAT16(in_stack_ffffffffffffec96,
                                                                    CONCAT15(
                                                  in_stack_ffffffffffffec95,
                                                  CONCAT14(in_stack_ffffffffffffec94,
                                                           in_stack_ffffffffffffec90)))));
                                      string_split<std::__cxx11::string>
                                                ((string *)in_stack_ffffffffffffecc8._M_current,
                                                 (char)(in_stack_ffffffffffffecc4 >> 0x18));
                                      std::__cxx11::string::~string(local_b70);
                                      std::allocator<char>::~allocator(&local_b71);
                                      local_b38 = local_b50;
                                      local_b80._M_current =
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)std::
                                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ::begin((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)in_stack_ffffffffffffec58);
                                      local_b88 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::end((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)in_stack_ffffffffffffec58);
                                      while (bVar1 = __gnu_cxx::operator!=
                                                               ((
                                                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)in_stack_ffffffffffffec60,
                                                  (
                                                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)in_stack_ffffffffffffec58), bVar1) {
                                        pbVar6 = __gnu_cxx::
                                                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                 ::operator*(&local_b80);
                                        std::__cxx11::string::string(local_ba8,(string *)pbVar6);
                                        std::__cxx11::
                                        basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                                        basic_regex((
                                                  basic_regex<char,_std::__cxx11::regex_traits<char>_>
                                                  *)in_stack_ffffffffffffeca0,
                                                  in_stack_ffffffffffffec98,
                                                  CONCAT13(in_stack_ffffffffffffec97,
                                                           CONCAT12(in_stack_ffffffffffffec96,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffec95,
                                                  in_stack_ffffffffffffec94))));
                                        in_stack_ffffffffffffed38 = local_ba8;
                                        local_c60 = std::__cxx11::string::begin();
                                        __gnu_cxx::
                                        __normal_iterator<char_const*,std::__cxx11::string>::
                                        __normal_iterator<char*>
                                                  ((
                                                  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)in_stack_ffffffffffffec60,
                                                  (
                                                  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)in_stack_ffffffffffffec58);
                                        local_c70 = std::__cxx11::string::end();
                                        __gnu_cxx::
                                        __normal_iterator<char_const*,std::__cxx11::string>::
                                        __normal_iterator<char*>
                                                  ((
                                                  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)in_stack_ffffffffffffec60,
                                                  (
                                                  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)in_stack_ffffffffffffec58);
                                        std::__cxx11::
                                        regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                                        ::regex_token_iterator
                                                  ((
                                                  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                                                  *)CONCAT44(in_stack_ffffffffffffecc4,
                                                             in_stack_ffffffffffffecc0),
                                                  in_stack_ffffffffffffecd0,
                                                  in_stack_ffffffffffffecc8,
                                                  (regex_type *)in_stack_ffffffffffffecb8._M_current
                                                  ,(int)((ulong)in_stack_ffffffffffffecb0._M_current
                                                        >> 0x20),
                                                  (match_flag_type)
                                                  in_stack_ffffffffffffecb0._M_current);
                                        std::__cxx11::
                                        regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                                        ::regex_token_iterator
                                                  (in_stack_ffffffffffffec80,
                                                   (
                                                  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                                                  *)CONCAT17(in_stack_ffffffffffffec7f,
                                                             CONCAT16(in_stack_ffffffffffffec7e,
                                                                      CONCAT15(
                                                  in_stack_ffffffffffffec7d,
                                                  CONCAT14(in_stack_ffffffffffffec7c,
                                                           in_stack_ffffffffffffec78)))));
                                        std::__cxx11::
                                        regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                                        ::regex_token_iterator
                                                  ((
                                                  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                                                  *)in_stack_ffffffffffffec60);
                                        in_stack_ffffffffffffed30 = local_d99;
                                        std::
                                        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ::allocator((
                                                  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)0x160f64);
                                        std::
                                        vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                        ::
                                        vector<std::__cxx11::regex_token_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char,std::__cxx11::regex_traits<char>>,void>
                                                  (in_stack_ffffffffffffedb0,
                                                   in_stack_ffffffffffffeda8,
                                                   in_stack_ffffffffffffeda0,
                                                   (allocator_type *)
                                                   CONCAT44(in_stack_ffffffffffffed9c,
                                                            in_stack_ffffffffffffed98));
                                        std::
                                        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ::~allocator((
                                                  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)0x160f98);
                                        std::__cxx11::
                                        regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                                        ::~regex_token_iterator
                                                  ((
                                                  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                                                  *)in_stack_ffffffffffffec60);
                                        std::__cxx11::
                                        regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                                        ::~regex_token_iterator
                                                  ((
                                                  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                                                  *)in_stack_ffffffffffffec60);
                                        in_stack_ffffffffffffed20 =
                                             (vector<bool,_std::allocator<bool>_> *)
                                             std::
                                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ::size(&local_c88);
                                        in_stack_ffffffffffffed28 =
                                             (vector<bool,_std::allocator<bool>_> *)
                                             llama_max_devices();
                                        if (in_stack_ffffffffffffed28 < in_stack_ffffffffffffed20) {
                                          auVar12 = ggml_abort(
                                                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/llama-bench/llama-bench.cpp"
                                                  ,0x224,"GGML_ASSERT(%s) failed",
                                                  "split_arg.size() <= llama_max_devices()");
                                          local_7c = auVar12._8_4_;
                                          local_78 = auVar12._0_8_;
                                          std::
                                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ::~vector((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)in_stack_ffffffffffffec70._M_current);
                                          std::__cxx11::string::~string(local_68);
                                          std::__cxx11::string::~string(local_40);
                                          cmd_params::~cmd_params(in_stack_ffffffffffffec60);
                                          _Unwind_Resume(local_78);
                                        }
                                        llama_max_devices();
                                        std::allocator<float>::allocator
                                                  ((allocator<float> *)0x161109);
                                        std::vector<float,_std::allocator<float>_>::vector
                                                  ((vector<float,_std::allocator<float>_> *)
                                                   in_stack_ffffffffffffec80,
                                                   CONCAT17(in_stack_ffffffffffffec7f,
                                                            CONCAT16(in_stack_ffffffffffffec7e,
                                                                     CONCAT15(
                                                  in_stack_ffffffffffffec7d,
                                                  CONCAT14(in_stack_ffffffffffffec7c,
                                                           in_stack_ffffffffffffec78)))),
                                                  (allocator_type *)
                                                  in_stack_ffffffffffffec70._M_current);
                                        std::allocator<float>::~allocator
                                                  ((allocator<float> *)0x161135);
                                        local_dc8 = (vector<bool,_std::allocator<bool>_> *)0x0;
                                        while (in_stack_ffffffffffffed00 = local_dc8,
                                              pvVar7 = (vector<bool,_std::allocator<bool>_> *)
                                                       llama_max_devices(),
                                              in_stack_ffffffffffffed00 < pvVar7) {
                                          in_stack_ffffffffffffecf8 = local_dc8;
                                          pvVar7 = (vector<bool,_std::allocator<bool>_> *)
                                                   std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::size(&local_c88);
                                          if (in_stack_ffffffffffffecf8 < pvVar7) {
                                            std::
                                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ::operator[](&local_c88,(size_type)local_dc8);
                                            in_stack_ffffffffffffecf4 =
                                                 std::__cxx11::stof((string *)
                                                                    in_stack_ffffffffffffec60,
                                                                    (size_t *)
                                                                    in_stack_ffffffffffffec58);
                                            pvVar8 = std::vector<float,_std::allocator<float>_>::
                                                     operator[](&local_db8,(size_type)local_dc8);
                                            *pvVar8 = in_stack_ffffffffffffecf4;
                                          }
                                          else {
                                            pvVar8 = std::vector<float,_std::allocator<float>_>::
                                                     operator[](&local_db8,(size_type)local_dc8);
                                            *pvVar8 = 0.0;
                                          }
                                          local_dc8 = (vector<bool,_std::allocator<bool>_> *)
                                                      ((long)&(local_dc8->
                                                                                                                            
                                                  super__Bvector_base<std::allocator<bool>_>).
                                                  _M_impl.super__Bvector_impl_data._M_start.
                                                  super__Bit_iterator_base._M_p + 1);
                                        }
                                        std::
                                        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                        ::push_back((
                                                  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                                  *)in_stack_ffffffffffffec70._M_current,
                                                  (value_type *)in_stack_ffffffffffffec68._M_current
                                                  );
                                        std::vector<float,_std::allocator<float>_>::~vector
                                                  ((vector<float,_std::allocator<float>_> *)
                                                   in_stack_ffffffffffffec70._M_current);
                                        std::
                                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ::~vector((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)in_stack_ffffffffffffec70._M_current);
                                        std::__cxx11::
                                        regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                                        ::~regex_token_iterator
                                                  ((
                                                  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                                                  *)in_stack_ffffffffffffec60);
                                        std::__cxx11::
                                        basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                                        ~basic_regex((
                                                  basic_regex<char,_std::__cxx11::regex_traits<char>_>
                                                  *)in_stack_ffffffffffffec60);
                                        std::__cxx11::string::~string(local_ba8);
                                        __gnu_cxx::
                                        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ::operator++(&local_b80);
                                      }
                                      local_218 = 0xb;
                                      std::
                                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 *)in_stack_ffffffffffffec70._M_current);
                                    }
                                    else {
                                      in_stack_ffffffffffffecf3 =
                                           std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_ffffffffffffec60,
                                                  (char *)in_stack_ffffffffffffec58);
                                      if (((bool)in_stack_ffffffffffffecf3) ||
                                         (in_stack_ffffffffffffecf2 =
                                               std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_ffffffffffffec60,
                                                  (char *)in_stack_ffffffffffffec58),
                                         (bool)in_stack_ffffffffffffecf2)) {
                                        local_84 = local_84 + 1;
                                        if (local_c <= local_84) {
                                          local_41 = 1;
                                          goto LAB_00161a81;
                                        }
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  (in_stack_ffffffffffffeca0,
                                                   in_stack_ffffffffffffec98,
                                                   (allocator<char> *)
                                                   CONCAT17(in_stack_ffffffffffffec97,
                                                            CONCAT16(in_stack_ffffffffffffec96,
                                                                     CONCAT15(
                                                  in_stack_ffffffffffffec95,
                                                  CONCAT14(in_stack_ffffffffffffec94,
                                                           in_stack_ffffffffffffec90)))));
                                        iVar3 = std::__cxx11::stoi((string *)
                                                                   in_stack_ffffffffffffec60,
                                                                   (size_t *)
                                                                   in_stack_ffffffffffffec58,0);
                                        in_RDI->reps = iVar3;
                                        std::__cxx11::string::~string(local_de8);
                                        std::allocator<char>::~allocator(&local_de9);
                                      }
                                      else {
                                        bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_ffffffffffffec60,
                                                  (char *)in_stack_ffffffffffffec58);
                                        if (bVar1) {
                                          local_84 = local_84 + 1;
                                          if (local_c <= local_84) {
                                            local_41 = 1;
                                            goto LAB_00161a81;
                                          }
                                          in_stack_ffffffffffffecc8._M_current =
                                               *(char **)(local_18 + (long)local_84 * 8);
                                          in_stack_ffffffffffffecd0._M_current = (char *)&local_e11;
                                          std::allocator<char>::allocator();
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    (in_stack_ffffffffffffeca0,
                                                     in_stack_ffffffffffffec98,
                                                     (allocator<char> *)
                                                     CONCAT17(in_stack_ffffffffffffec97,
                                                              CONCAT16(in_stack_ffffffffffffec96,
                                                                       CONCAT15(
                                                  in_stack_ffffffffffffec95,
                                                  CONCAT14(in_stack_ffffffffffffec94,
                                                           in_stack_ffffffffffffec90)))));
                                          in_stack_ffffffffffffecc4 =
                                               std::__cxx11::stoi((string *)
                                                                  in_stack_ffffffffffffec60,
                                                                  (size_t *)
                                                                  in_stack_ffffffffffffec58,0);
                                          in_RDI->prio = in_stack_ffffffffffffecc4;
                                          std::__cxx11::string::~string(local_e10);
                                          std::allocator<char>::~allocator(&local_e11);
                                        }
                                        else {
                                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_ffffffffffffec60,
                                                  (char *)in_stack_ffffffffffffec58);
                                          in_stack_ffffffffffffecc0 =
                                               CONCAT13(bVar1,(int3)in_stack_ffffffffffffecc0);
                                          if (bVar1) {
                                            local_84 = local_84 + 1;
                                            if (local_c <= local_84) {
                                              local_41 = 1;
                                              goto LAB_00161a81;
                                            }
                                            in_stack_ffffffffffffecb0._M_current =
                                                 *(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  **)(local_18 + (long)local_84 * 8);
                                            in_stack_ffffffffffffecb8._M_current =
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_e39;
                                            std::allocator<char>::allocator();
                                            std::__cxx11::string::string<std::allocator<char>>
                                                      (in_stack_ffffffffffffeca0,
                                                       in_stack_ffffffffffffec98,
                                                       (allocator<char> *)
                                                       CONCAT17(in_stack_ffffffffffffec97,
                                                                CONCAT16(in_stack_ffffffffffffec96,
                                                                         CONCAT15(
                                                  in_stack_ffffffffffffec95,
                                                  CONCAT14(in_stack_ffffffffffffec94,
                                                           in_stack_ffffffffffffec90)))));
                                            in_stack_ffffffffffffecac =
                                                 std::__cxx11::stoi((string *)
                                                                    in_stack_ffffffffffffec60,
                                                                    (size_t *)
                                                                    in_stack_ffffffffffffec58,0);
                                            in_RDI->delay = in_stack_ffffffffffffecac;
                                            std::__cxx11::string::~string((string *)(local_e39 + 1))
                                            ;
                                            std::allocator<char>::~allocator
                                                      ((allocator<char> *)local_e39);
                                          }
                                          else {
                                            in_stack_ffffffffffffecab =
                                                 std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_ffffffffffffec60,
                                                  (char *)in_stack_ffffffffffffec58);
                                            if (((bool)in_stack_ffffffffffffecab) ||
                                               (in_stack_ffffffffffffecaa =
                                                     std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_ffffffffffffec60,
                                                  (char *)in_stack_ffffffffffffec58),
                                               (bool)in_stack_ffffffffffffecaa)) {
                                              local_84 = local_84 + 1;
                                              if (local_c <= local_84) {
                                                local_41 = 1;
                                                goto LAB_00161a81;
                                              }
                                              in_stack_ffffffffffffec98 =
                                                   *(char **)(local_18 + (long)local_84 * 8);
                                              in_stack_ffffffffffffeca0 =
                                                   (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_e61;
                                              std::allocator<char>::allocator();
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        (in_stack_ffffffffffffeca0,
                                                         in_stack_ffffffffffffec98,
                                                         (allocator<char> *)
                                                         CONCAT17(in_stack_ffffffffffffec97,
                                                                  CONCAT16(in_stack_ffffffffffffec96
                                                                           ,CONCAT15(
                                                  in_stack_ffffffffffffec95,
                                                  CONCAT14(in_stack_ffffffffffffec94,
                                                           in_stack_ffffffffffffec90)))));
                                              in_stack_ffffffffffffec97 =
                                                   output_format_from_str
                                                             (in_stack_ffffffffffffec58,
                                                              (output_formats *)0x1617cb);
                                              local_41 = (in_stack_ffffffffffffec97 ^ 0xff) & 1;
                                              std::__cxx11::string::~string
                                                        ((string *)(local_e61 + 1));
                                              std::allocator<char>::~allocator
                                                        ((allocator<char> *)local_e61);
                                            }
                                            else {
                                              in_stack_ffffffffffffec96 =
                                                   std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_ffffffffffffec60,
                                                  (char *)in_stack_ffffffffffffec58);
                                              if (((bool)in_stack_ffffffffffffec96) ||
                                                 (in_stack_ffffffffffffec95 =
                                                       std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_ffffffffffffec60,
                                                  (char *)in_stack_ffffffffffffec58),
                                                 (bool)in_stack_ffffffffffffec95)) {
                                                local_84 = local_84 + 1;
                                                if (local_c <= local_84) {
                                                  local_41 = 1;
                                                  goto LAB_00161a81;
                                                }
                                                in_stack_ffffffffffffec80 =
                                                     *(
                                                  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                                                  **)(local_18 + (long)local_84 * 8);
                                                std::allocator<char>::allocator();
                                                std::__cxx11::string::string<std::allocator<char>>
                                                          (in_stack_ffffffffffffeca0,
                                                           in_stack_ffffffffffffec98,
                                                           (allocator<char> *)
                                                           CONCAT17(in_stack_ffffffffffffec97,
                                                                    CONCAT16(
                                                  in_stack_ffffffffffffec96,
                                                  CONCAT15(in_stack_ffffffffffffec95,
                                                           CONCAT14(in_stack_ffffffffffffec94,
                                                                    in_stack_ffffffffffffec90)))));
                                                in_stack_ffffffffffffec7f =
                                                     output_format_from_str
                                                               (in_stack_ffffffffffffec58,
                                                                (output_formats *)0x16191a);
                                                local_41 = (in_stack_ffffffffffffec7f ^ 0xff) & 1;
                                                std::__cxx11::string::~string(local_e88);
                                                std::allocator<char>::~allocator(&local_e89);
                                              }
                                              else {
                                                in_stack_ffffffffffffec7e =
                                                     std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_ffffffffffffec60,
                                                  (char *)in_stack_ffffffffffffec58);
                                                if (((bool)in_stack_ffffffffffffec7e) ||
                                                   (in_stack_ffffffffffffec7d =
                                                         std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_ffffffffffffec60,
                                                  (char *)in_stack_ffffffffffffec58),
                                                  (bool)in_stack_ffffffffffffec7d)) {
                                                  in_RDI->verbose = true;
                                                }
                                                else {
                                                  in_stack_ffffffffffffec7c =
                                                       std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_ffffffffffffec60,
                                                  (char *)in_stack_ffffffffffffec58);
                                                  if (!(bool)in_stack_ffffffffffffec7c) {
                                                    local_41 = 1;
                                                    goto LAB_00161a81;
                                                  }
                                                  in_RDI->progress = true;
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
                goto LAB_00161a67;
              }
              local_84 = local_84 + 1;
              if (local_c <= local_84) {
                local_41 = 1;
                goto LAB_00161a81;
              }
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_ffffffffffffeca0,in_stack_ffffffffffffec98,
                         (allocator<char> *)
                         CONCAT17(in_stack_ffffffffffffec97,
                                  CONCAT16(in_stack_ffffffffffffec96,
                                           CONCAT15(in_stack_ffffffffffffec95,
                                                    CONCAT14(in_stack_ffffffffffffec94,
                                                             in_stack_ffffffffffffec90)))));
              string_split<std::__cxx11::string>
                        ((string *)in_stack_ffffffffffffecc8._M_current,
                         (char)(in_stack_ffffffffffffecc4 >> 0x18));
              std::__cxx11::string::~string(local_3d8);
              std::allocator<char>::~allocator((allocator<char> *)(local_3f8 + 0x1f));
              std::vector<ggml_type,_std::allocator<ggml_type>_>::vector
                        ((vector<ggml_type,_std::allocator<ggml_type>_> *)0x15eaf1);
              local_400 = local_3b8;
              local_408._M_current =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)in_stack_ffffffffffffec58);
              local_410 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)in_stack_ffffffffffffec58);
              while (bVar1 = __gnu_cxx::operator!=
                                       ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)in_stack_ffffffffffffec60,
                                        (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)in_stack_ffffffffffffec58), bVar1) {
                local_418 = __gnu_cxx::
                            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator*(&local_408);
                local_41c = ggml_type_from_name(in_stack_ffffffffffffec58);
                if (local_41c == GGML_TYPE_COUNT) {
                  local_41 = 1;
                  break;
                }
                std::vector<ggml_type,_std::allocator<ggml_type>_>::push_back
                          ((vector<ggml_type,_std::allocator<ggml_type>_> *)
                           in_stack_ffffffffffffec70._M_current,
                           (value_type *)in_stack_ffffffffffffec68._M_current);
                __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator++(&local_408);
              }
              if ((local_41 & 1) == 0) {
                local_430 = (ggml_type *)
                            std::vector<ggml_type,_std::allocator<ggml_type>_>::end
                                      ((vector<ggml_type,_std::allocator<ggml_type>_> *)
                                       in_stack_ffffffffffffec58);
                __gnu_cxx::
                __normal_iterator<ggml_type_const*,std::vector<ggml_type,std::allocator<ggml_type>>>
                ::__normal_iterator<ggml_type*>
                          ((__normal_iterator<const_ggml_type_*,_std::vector<ggml_type,_std::allocator<ggml_type>_>_>
                            *)in_stack_ffffffffffffec60,
                           (__normal_iterator<ggml_type_*,_std::vector<ggml_type,_std::allocator<ggml_type>_>_>
                            *)in_stack_ffffffffffffec58);
                in_stack_ffffffffffffefb8 = (string *)local_3f8;
                local_438 = (ggml_type *)
                            std::vector<ggml_type,_std::allocator<ggml_type>_>::begin
                                      ((vector<ggml_type,_std::allocator<ggml_type>_> *)
                                       in_stack_ffffffffffffec58);
                local_440 = (ggml_type *)
                            std::vector<ggml_type,_std::allocator<ggml_type>_>::end
                                      ((vector<ggml_type,_std::allocator<ggml_type>_> *)
                                       in_stack_ffffffffffffec58);
                __last_05._M_current._2_1_ = in_stack_ffffffffffffecaa;
                __last_05._M_current._0_2_ = in_stack_ffffffffffffeca8;
                __last_05._M_current._3_1_ = in_stack_ffffffffffffecab;
                __last_05._M_current._4_4_ = in_stack_ffffffffffffecac;
                local_448 = (ggml_type *)
                            std::vector<ggml_type,std::allocator<ggml_type>>::
                            insert<__gnu_cxx::__normal_iterator<ggml_type*,std::vector<ggml_type,std::allocator<ggml_type>>>,void>
                                      ((vector<ggml_type,_std::allocator<ggml_type>_> *)
                                       in_stack_ffffffffffffeca0,
                                       (const_iterator)in_stack_ffffffffffffecb8._M_current,
                                       (__normal_iterator<ggml_type_*,_std::vector<ggml_type,_std::allocator<ggml_type>_>_>
                                        )in_stack_ffffffffffffecb0._M_current,__last_05);
                local_218 = 0;
              }
              else {
                local_218 = 2;
              }
              std::vector<ggml_type,_std::allocator<ggml_type>_>::~vector
                        ((vector<ggml_type,_std::allocator<ggml_type>_> *)
                         in_stack_ffffffffffffec70._M_current);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_ffffffffffffec70._M_current);
            }
joined_r0x0015e1f0:
            if (local_218 != 0) goto LAB_00161a81;
          }
        }
      }
    }
  }
LAB_00161a67:
  local_84 = local_84 + 1;
  goto LAB_0015d7a4;
}

Assistant:

static cmd_params parse_cmd_params(int argc, char ** argv) {
    cmd_params        params;
    std::string       arg;
    bool              invalid_param = false;
    const std::string arg_prefix    = "--";
    const char        split_delim   = ',';

    params.verbose              = cmd_params_defaults.verbose;
    params.output_format        = cmd_params_defaults.output_format;
    params.output_format_stderr = cmd_params_defaults.output_format_stderr;
    params.reps                 = cmd_params_defaults.reps;
    params.numa                 = cmd_params_defaults.numa;
    params.prio                 = cmd_params_defaults.prio;
    params.delay                = cmd_params_defaults.delay;
    params.progress             = cmd_params_defaults.progress;

    for (int i = 1; i < argc; i++) {
        arg = argv[i];
        if (arg.compare(0, arg_prefix.size(), arg_prefix) == 0) {
            std::replace(arg.begin(), arg.end(), '_', '-');
        }

        if (arg == "-h" || arg == "--help") {
            print_usage(argc, argv);
            exit(0);
        } else if (arg == "-m" || arg == "--model") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<std::string>(argv[i], split_delim);
            params.model.insert(params.model.end(), p.begin(), p.end());
        } else if (arg == "-p" || arg == "--n-prompt") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<int>(argv[i], split_delim);
            params.n_prompt.insert(params.n_prompt.end(), p.begin(), p.end());
        } else if (arg == "-n" || arg == "--n-gen") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<int>(argv[i], split_delim);
            params.n_gen.insert(params.n_gen.end(), p.begin(), p.end());
        } else if (arg == "-pg") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<std::string>(argv[i], ',');
            if (p.size() != 2) {
                invalid_param = true;
                break;
            }
            params.n_pg.push_back({ std::stoi(p[0]), std::stoi(p[1]) });
        } else if (arg == "-b" || arg == "--batch-size") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<int>(argv[i], split_delim);
            params.n_batch.insert(params.n_batch.end(), p.begin(), p.end());
        } else if (arg == "-ub" || arg == "--ubatch-size") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<int>(argv[i], split_delim);
            params.n_ubatch.insert(params.n_ubatch.end(), p.begin(), p.end());
        } else if (arg == "-ctk" || arg == "--cache-type-k") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto                   p = string_split<std::string>(argv[i], split_delim);
            std::vector<ggml_type> types;
            for (const auto & t : p) {
                ggml_type gt = ggml_type_from_name(t);
                if (gt == GGML_TYPE_COUNT) {
                    invalid_param = true;
                    break;
                }
                types.push_back(gt);
            }
            if (invalid_param) {
                break;
            }
            params.type_k.insert(params.type_k.end(), types.begin(), types.end());
        } else if (arg == "-ctv" || arg == "--cache-type-v") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto                   p = string_split<std::string>(argv[i], split_delim);
            std::vector<ggml_type> types;
            for (const auto & t : p) {
                ggml_type gt = ggml_type_from_name(t);
                if (gt == GGML_TYPE_COUNT) {
                    invalid_param = true;
                    break;
                }
                types.push_back(gt);
            }
            if (invalid_param) {
                break;
            }
            params.type_v.insert(params.type_v.end(), types.begin(), types.end());
        } else if (arg == "-t" || arg == "--threads") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<int>(argv[i], split_delim);
            params.n_threads.insert(params.n_threads.end(), p.begin(), p.end());
        } else if (arg == "-C" || arg == "--cpu-mask") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<std::string>(argv[i], split_delim);
            params.cpu_mask.insert(params.cpu_mask.end(), p.begin(), p.end());
        } else if (arg == "--cpu-strict") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<bool>(argv[i], split_delim);
            params.cpu_strict.insert(params.cpu_strict.end(), p.begin(), p.end());
        } else if (arg == "--poll") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<int>(argv[i], split_delim);
            params.poll.insert(params.poll.end(), p.begin(), p.end());
        } else if (arg == "-ngl" || arg == "--n-gpu-layers") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<int>(argv[i], split_delim);
            params.n_gpu_layers.insert(params.n_gpu_layers.end(), p.begin(), p.end());
        } else if (llama_supports_rpc() && (arg == "-rpc" || arg == "--rpc")) {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            params.rpc_servers.push_back(argv[i]);
        } else if (arg == "-sm" || arg == "--split-mode") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto                          p = string_split<std::string>(argv[i], split_delim);
            std::vector<llama_split_mode> modes;
            for (const auto & m : p) {
                llama_split_mode mode;
                if (m == "none") {
                    mode = LLAMA_SPLIT_MODE_NONE;
                } else if (m == "layer") {
                    mode = LLAMA_SPLIT_MODE_LAYER;
                } else if (m == "row") {
                    mode = LLAMA_SPLIT_MODE_ROW;
                } else {
                    invalid_param = true;
                    break;
                }
                modes.push_back(mode);
            }
            if (invalid_param) {
                break;
            }
            params.split_mode.insert(params.split_mode.end(), modes.begin(), modes.end());
        } else if (arg == "-mg" || arg == "--main-gpu") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            params.main_gpu = string_split<int>(argv[i], split_delim);
        } else if (arg == "-nkvo" || arg == "--no-kv-offload") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<bool>(argv[i], split_delim);
            params.no_kv_offload.insert(params.no_kv_offload.end(), p.begin(), p.end());
        } else if (arg == "--numa") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            } else {
                std::string value(argv[i]);
                /**/ if (value == "distribute" || value == "") {
                    params.numa = GGML_NUMA_STRATEGY_DISTRIBUTE;
                } else if (value == "isolate") {
                    params.numa = GGML_NUMA_STRATEGY_ISOLATE;
                } else if (value == "numactl") {
                    params.numa = GGML_NUMA_STRATEGY_NUMACTL;
                } else {
                    invalid_param = true;
                    break;
                }
            }
        } else if (arg == "-fa" || arg == "--flash-attn") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<bool>(argv[i], split_delim);
            params.flash_attn.insert(params.flash_attn.end(), p.begin(), p.end());
        } else if (arg == "-mmp" || arg == "--mmap") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<bool>(argv[i], split_delim);
            params.use_mmap.insert(params.use_mmap.end(), p.begin(), p.end());
        } else if (arg == "-embd" || arg == "--embeddings") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<bool>(argv[i], split_delim);
            params.embeddings.insert(params.embeddings.end(), p.begin(), p.end());
        } else if (arg == "-ts" || arg == "--tensor-split") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            for (auto ts : string_split<std::string>(argv[i], split_delim)) {
                // split string by ; and /
                const std::regex           regex{ R"([;/]+)" };
                std::sregex_token_iterator it{ ts.begin(), ts.end(), regex, -1 };
                std::vector<std::string>   split_arg{ it, {} };
                GGML_ASSERT(split_arg.size() <= llama_max_devices());

                std::vector<float> tensor_split(llama_max_devices());
                for (size_t i = 0; i < llama_max_devices(); ++i) {
                    if (i < split_arg.size()) {
                        tensor_split[i] = std::stof(split_arg[i]);
                    } else {
                        tensor_split[i] = 0.0f;
                    }
                }
                params.tensor_split.push_back(tensor_split);
            }
        } else if (arg == "-r" || arg == "--repetitions") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            params.reps = std::stoi(argv[i]);
        } else if (arg == "--prio") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            params.prio = (enum ggml_sched_priority) std::stoi(argv[i]);
        } else if (arg == "--delay") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            params.delay = std::stoi(argv[i]);
        } else if (arg == "-o" || arg == "--output") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            invalid_param = !output_format_from_str(argv[i], params.output_format);
        } else if (arg == "-oe" || arg == "--output-err") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            invalid_param = !output_format_from_str(argv[i], params.output_format_stderr);
        } else if (arg == "-v" || arg == "--verbose") {
            params.verbose = true;
        } else if (arg == "--progress") {
            params.progress = true;
        } else {
            invalid_param = true;
            break;
        }
    }
    if (invalid_param) {
        fprintf(stderr, "error: invalid parameter for argument: %s\n", arg.c_str());
        print_usage(argc, argv);
        exit(1);
    }

    // set defaults
    if (params.model.empty()) {
        params.model = cmd_params_defaults.model;
    }
    if (params.n_prompt.empty()) {
        params.n_prompt = cmd_params_defaults.n_prompt;
    }
    if (params.n_gen.empty()) {
        params.n_gen = cmd_params_defaults.n_gen;
    }
    if (params.n_pg.empty()) {
        params.n_pg = cmd_params_defaults.n_pg;
    }
    if (params.n_batch.empty()) {
        params.n_batch = cmd_params_defaults.n_batch;
    }
    if (params.n_ubatch.empty()) {
        params.n_ubatch = cmd_params_defaults.n_ubatch;
    }
    if (params.type_k.empty()) {
        params.type_k = cmd_params_defaults.type_k;
    }
    if (params.type_v.empty()) {
        params.type_v = cmd_params_defaults.type_v;
    }
    if (params.n_gpu_layers.empty()) {
        params.n_gpu_layers = cmd_params_defaults.n_gpu_layers;
    }
    if (params.rpc_servers.empty()) {
        params.rpc_servers = cmd_params_defaults.rpc_servers;
    }
    if (params.split_mode.empty()) {
        params.split_mode = cmd_params_defaults.split_mode;
    }
    if (params.main_gpu.empty()) {
        params.main_gpu = cmd_params_defaults.main_gpu;
    }
    if (params.no_kv_offload.empty()) {
        params.no_kv_offload = cmd_params_defaults.no_kv_offload;
    }
    if (params.flash_attn.empty()) {
        params.flash_attn = cmd_params_defaults.flash_attn;
    }
    if (params.tensor_split.empty()) {
        params.tensor_split = cmd_params_defaults.tensor_split;
    }
    if (params.use_mmap.empty()) {
        params.use_mmap = cmd_params_defaults.use_mmap;
    }
    if (params.embeddings.empty()) {
        params.embeddings = cmd_params_defaults.embeddings;
    }
    if (params.n_threads.empty()) {
        params.n_threads = cmd_params_defaults.n_threads;
    }
    if (params.cpu_mask.empty()) {
        params.cpu_mask = cmd_params_defaults.cpu_mask;
    }
    if (params.cpu_strict.empty()) {
        params.cpu_strict = cmd_params_defaults.cpu_strict;
    }
    if (params.poll.empty()) {
        params.poll = cmd_params_defaults.poll;
    }

    return params;
}